

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  ulong uVar70;
  long lVar71;
  RTCIntersectArguments *pRVar72;
  Geometry *geometry;
  long lVar73;
  ulong uVar74;
  Geometry *pGVar75;
  uint uVar76;
  bool bVar77;
  ulong uVar78;
  float fVar79;
  float fVar80;
  float fVar127;
  float fVar129;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar133;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined4 uVar134;
  undefined8 uVar135;
  vint4 bi_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar142;
  vint4 bi_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  float fVar158;
  float fVar162;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar163;
  float fVar170;
  float fVar171;
  vint4 ai_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar172;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  vint4 ai;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_621;
  int local_61c;
  RayQueryContext *local_618;
  Primitive *local_610;
  ulong local_608;
  ulong local_600;
  ulong local_5f8;
  Precalculations *local_5f0;
  uint local_5e4;
  RTCFilterFunctionNArguments local_5e0;
  undefined8 local_5b0;
  undefined4 local_5a8;
  float local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  uint local_594;
  uint local_590;
  ulong local_578;
  Geometry *local_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  byte local_230;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar70 = (ulong)(byte)PVar7;
  lVar26 = uVar70 * 0x25;
  fVar158 = *(float *)(prim + lVar26 + 0x12);
  auVar88 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar26 + 6));
  auVar147._0_4_ = fVar158 * (ray->dir).field_0.m128[0];
  auVar147._4_4_ = fVar158 * (ray->dir).field_0.m128[1];
  auVar147._8_4_ = fVar158 * (ray->dir).field_0.m128[2];
  auVar147._12_4_ = fVar158 * (ray->dir).field_0.m128[3];
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar164._0_4_ = fVar158 * auVar88._0_4_;
  auVar164._4_4_ = fVar158 * auVar88._4_4_;
  auVar164._8_4_ = fVar158 * auVar88._8_4_;
  auVar164._12_4_ = fVar158 * auVar88._12_4_;
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar70 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar173._4_4_ = auVar147._0_4_;
  auVar173._0_4_ = auVar147._0_4_;
  auVar173._8_4_ = auVar147._0_4_;
  auVar173._12_4_ = auVar147._0_4_;
  auVar90 = vshufps_avx(auVar147,auVar147,0x55);
  auVar91 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar158 = auVar91._0_4_;
  auVar148._0_4_ = fVar158 * auVar82._0_4_;
  fVar142 = auVar91._4_4_;
  auVar148._4_4_ = fVar142 * auVar82._4_4_;
  fVar157 = auVar91._8_4_;
  auVar148._8_4_ = fVar157 * auVar82._8_4_;
  fVar163 = auVar91._12_4_;
  auVar148._12_4_ = fVar163 * auVar82._12_4_;
  auVar143._0_4_ = auVar83._0_4_ * fVar158;
  auVar143._4_4_ = auVar83._4_4_ * fVar142;
  auVar143._8_4_ = auVar83._8_4_ * fVar157;
  auVar143._12_4_ = auVar83._12_4_ * fVar163;
  auVar136._0_4_ = auVar84._0_4_ * fVar158;
  auVar136._4_4_ = auVar84._4_4_ * fVar142;
  auVar136._8_4_ = auVar84._8_4_ * fVar157;
  auVar136._12_4_ = auVar84._12_4_ * fVar163;
  auVar91 = vfmadd231ps_fma(auVar148,auVar90,auVar88);
  auVar28 = vfmadd231ps_fma(auVar143,auVar90,auVar22);
  auVar90 = vfmadd231ps_fma(auVar136,auVar24,auVar90);
  auVar91 = vfmadd231ps_fma(auVar91,auVar173,auVar89);
  auVar28 = vfmadd231ps_fma(auVar28,auVar173,auVar21);
  auVar29 = vfmadd231ps_fma(auVar90,auVar23,auVar173);
  auVar193._4_4_ = auVar164._0_4_;
  auVar193._0_4_ = auVar164._0_4_;
  auVar193._8_4_ = auVar164._0_4_;
  auVar193._12_4_ = auVar164._0_4_;
  auVar90 = vshufps_avx(auVar164,auVar164,0x55);
  auVar81 = vshufps_avx512vl(auVar164,auVar164,0xaa);
  auVar82 = vmulps_avx512vl(auVar81,auVar82);
  auVar83 = vmulps_avx512vl(auVar81,auVar83);
  auVar84 = vmulps_avx512vl(auVar81,auVar84);
  auVar88 = vfmadd231ps_fma(auVar82,auVar90,auVar88);
  auVar82 = vfmadd231ps_fma(auVar83,auVar90,auVar22);
  auVar22 = vfmadd231ps_fma(auVar84,auVar90,auVar24);
  auVar30 = vfmadd231ps_fma(auVar88,auVar193,auVar89);
  auVar136 = vfmadd231ps_fma(auVar82,auVar193,auVar21);
  auVar184._8_4_ = 0x7fffffff;
  auVar184._0_8_ = 0x7fffffff7fffffff;
  auVar184._12_4_ = 0x7fffffff;
  auVar137 = vfmadd231ps_fma(auVar22,auVar193,auVar23);
  auVar89 = vandps_avx(auVar184,auVar91);
  auVar181._8_4_ = 0x219392ef;
  auVar181._0_8_ = 0x219392ef219392ef;
  auVar181._12_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar89,auVar181,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar85._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar91._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar91._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar91._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar91._12_4_;
  auVar89 = vandps_avx(auVar184,auVar28);
  uVar78 = vcmpps_avx512vl(auVar89,auVar181,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar86._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar28._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar28._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar28._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar28._12_4_;
  auVar89 = vandps_avx(auVar184,auVar29);
  uVar78 = vcmpps_avx512vl(auVar89,auVar181,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar87._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar29._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar29._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar29._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar29._12_4_;
  auVar88 = vrcp14ps_avx512vl(auVar85);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = &DAT_3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar89 = vfnmadd213ps_fma(auVar85,auVar88,auVar182);
  auVar29 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar86);
  auVar89 = vfnmadd213ps_fma(auVar86,auVar88,auVar182);
  auVar81 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar87);
  auVar89 = vfnmadd213ps_fma(auVar87,auVar88,auVar182);
  auVar27 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
  fVar158 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar179._4_4_ = fVar158;
  auVar179._0_4_ = fVar158;
  auVar179._8_4_ = fVar158;
  auVar179._12_4_ = fVar158;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar88 = vpmovsxwd_avx(auVar88);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar21 = vsubps_avx(auVar88,auVar89);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar88 = vpmovsxwd_avx(auVar82);
  auVar82 = vfmadd213ps_fma(auVar21,auVar179,auVar89);
  auVar89 = vcvtdq2ps_avx(auVar88);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar88 = vpmovsxwd_avx(auVar21);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar89);
  auVar21 = vfmadd213ps_fma(auVar88,auVar179,auVar89);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar89 = vpmovsxwd_avx(auVar22);
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar78 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar78 + 6);
  auVar88 = vpmovsxwd_avx(auVar83);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar89);
  auVar22 = vfmadd213ps_fma(auVar88,auVar179,auVar89);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar89 = vpmovsxwd_avx(auVar23);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar88 = vpmovsxwd_avx(auVar24);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar89);
  auVar83 = vfmadd213ps_fma(auVar88,auVar179,auVar89);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar89 = vpmovsxwd_avx(auVar84);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar88 = vpmovsxwd_avx(auVar90);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar89);
  auVar23 = vfmadd213ps_fma(auVar88,auVar179,auVar89);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar70) + 6);
  auVar89 = vpmovsxwd_avx(auVar91);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar88 = vpmovsxwd_avx(auVar28);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar89);
  auVar88 = vfmadd213ps_fma(auVar88,auVar179,auVar89);
  auVar89 = vsubps_avx(auVar82,auVar30);
  auVar180._0_4_ = auVar29._0_4_ * auVar89._0_4_;
  auVar180._4_4_ = auVar29._4_4_ * auVar89._4_4_;
  auVar180._8_4_ = auVar29._8_4_ * auVar89._8_4_;
  auVar180._12_4_ = auVar29._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar21,auVar30);
  auVar149._0_4_ = auVar29._0_4_ * auVar89._0_4_;
  auVar149._4_4_ = auVar29._4_4_ * auVar89._4_4_;
  auVar149._8_4_ = auVar29._8_4_ * auVar89._8_4_;
  auVar149._12_4_ = auVar29._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar22,auVar136);
  auVar174._0_4_ = auVar81._0_4_ * auVar89._0_4_;
  auVar174._4_4_ = auVar81._4_4_ * auVar89._4_4_;
  auVar174._8_4_ = auVar81._8_4_ * auVar89._8_4_;
  auVar174._12_4_ = auVar81._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar83,auVar136);
  auVar144._0_4_ = auVar81._0_4_ * auVar89._0_4_;
  auVar144._4_4_ = auVar81._4_4_ * auVar89._4_4_;
  auVar144._8_4_ = auVar81._8_4_ * auVar89._8_4_;
  auVar144._12_4_ = auVar81._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar23,auVar137);
  auVar165._0_4_ = auVar27._0_4_ * auVar89._0_4_;
  auVar165._4_4_ = auVar27._4_4_ * auVar89._4_4_;
  auVar165._8_4_ = auVar27._8_4_ * auVar89._8_4_;
  auVar165._12_4_ = auVar27._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar88,auVar137);
  auVar137._0_4_ = auVar27._0_4_ * auVar89._0_4_;
  auVar137._4_4_ = auVar27._4_4_ * auVar89._4_4_;
  auVar137._8_4_ = auVar27._8_4_ * auVar89._8_4_;
  auVar137._12_4_ = auVar27._12_4_ * auVar89._12_4_;
  auVar89 = vpminsd_avx(auVar180,auVar149);
  auVar88 = vpminsd_avx(auVar174,auVar144);
  auVar89 = vmaxps_avx(auVar89,auVar88);
  auVar88 = vpminsd_avx(auVar165,auVar137);
  uVar134 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar29._4_4_ = uVar134;
  auVar29._0_4_ = uVar134;
  auVar29._8_4_ = uVar134;
  auVar29._12_4_ = uVar134;
  auVar88 = vmaxps_avx512vl(auVar88,auVar29);
  auVar89 = vmaxps_avx(auVar89,auVar88);
  auVar81._8_4_ = 0x3f7ffffa;
  auVar81._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar81._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar89,auVar81);
  auVar89 = vpmaxsd_avx(auVar180,auVar149);
  auVar88 = vpmaxsd_avx(auVar174,auVar144);
  auVar89 = vminps_avx(auVar89,auVar88);
  auVar88 = vpmaxsd_avx(auVar165,auVar137);
  fVar158 = ray->tfar;
  auVar27._4_4_ = fVar158;
  auVar27._0_4_ = fVar158;
  auVar27._8_4_ = fVar158;
  auVar27._12_4_ = fVar158;
  auVar88 = vminps_avx512vl(auVar88,auVar27);
  auVar89 = vminps_avx(auVar89,auVar88);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar30);
  auVar88 = vpbroadcastd_avx512vl();
  uVar135 = vcmpps_avx512vl(local_170,auVar89,2);
  uVar78 = vpcmpgtd_avx512vl(auVar88,_DAT_01ff0cf0);
  uVar78 = ((byte)uVar135 & 0xf) & uVar78;
  local_621 = (char)uVar78 != '\0';
  local_618 = context;
  local_5f0 = pre;
  if (local_621) {
    do {
      lVar26 = 0;
      for (uVar70 = uVar78; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      local_5f8 = (ulong)*(uint *)(prim + 2);
      local_578 = (ulong)*(uint *)(prim + lVar26 * 4 + 6);
      pGVar75 = (context->scene->geometries).items[local_5f8].ptr;
      uVar70 = (ulong)*(uint *)(*(long *)&pGVar75->field_0x58 +
                               local_578 *
                               pGVar75[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar158 = (pGVar75->time_range).lower;
      fVar158 = pGVar75->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar158) / ((pGVar75->time_range).upper - fVar158));
      auVar89 = vroundss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),9);
      auVar89 = vminss_avx(auVar89,ZEXT416((uint)(pGVar75->fnumTimeSegments + -1.0)));
      auVar89 = vmaxss_avx(ZEXT816(0) << 0x20,auVar89);
      fVar158 = fVar158 - auVar89._0_4_;
      fVar142 = 1.0 - fVar158;
      _Var9 = pGVar75[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar71 = (long)(int)auVar89._0_4_ * 0x38;
      lVar73 = *(long *)(_Var9 + 0x10 + lVar71);
      lVar10 = *(long *)(_Var9 + 0x38 + lVar71);
      lVar11 = *(long *)(_Var9 + 0x48 + lVar71);
      auVar138._4_4_ = fVar158;
      auVar138._0_4_ = fVar158;
      auVar138._8_4_ = fVar158;
      auVar138._12_4_ = fVar158;
      pfVar3 = (float *)(lVar10 + lVar11 * uVar70);
      auVar185._0_4_ = fVar158 * *pfVar3;
      auVar185._4_4_ = fVar158 * pfVar3[1];
      auVar185._8_4_ = fVar158 * pfVar3[2];
      auVar185._12_4_ = fVar158 * pfVar3[3];
      lVar26 = uVar70 + 1;
      auVar145._4_4_ = fVar142;
      auVar145._0_4_ = fVar142;
      auVar145._8_4_ = fVar142;
      auVar145._12_4_ = fVar142;
      local_550 = vfmadd231ps_fma(auVar185,auVar145,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var9 + lVar71) + lVar73 * uVar70));
      p_Var12 = pGVar75[4].occlusionFilterN;
      auVar89 = vmulps_avx512vl(auVar138,*(undefined1 (*) [16])(lVar10 + lVar11 * lVar26));
      local_3b0 = vfmadd231ps_avx512vl
                            (auVar89,auVar145,
                             *(undefined1 (*) [16])(*(long *)(_Var9 + lVar71) + lVar73 * lVar26));
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar71 + 0x38) +
                        uVar70 * *(long *)(p_Var12 + lVar71 + 0x48));
      auVar186._0_4_ = fVar158 * *pfVar3;
      auVar186._4_4_ = fVar158 * pfVar3[1];
      auVar186._8_4_ = fVar158 * pfVar3[2];
      auVar186._12_4_ = fVar158 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar71 + 0x38) +
                        *(long *)(p_Var12 + lVar71 + 0x48) * lVar26);
      auVar189._0_4_ = fVar158 * *pfVar3;
      auVar189._4_4_ = fVar158 * pfVar3[1];
      auVar189._8_4_ = fVar158 * pfVar3[2];
      auVar189._12_4_ = fVar158 * pfVar3[3];
      auVar89 = vfmadd231ps_fma(auVar186,auVar145,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar71) +
                                 *(long *)(p_Var12 + lVar71 + 0x10) * uVar70));
      auVar88 = vfmadd231ps_fma(auVar189,auVar145,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar71) +
                                 *(long *)(p_Var12 + lVar71 + 0x10) * lVar26));
      iVar8 = (int)pGVar75[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar26 = (long)iVar8 * 0x44;
      auVar139._8_4_ = 0xbeaaaaab;
      auVar139._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar139._12_4_ = 0xbeaaaaab;
      local_3c0 = vfnmadd213ps_fma(auVar89,auVar139,local_550);
      local_3d0 = vfmadd213ps_avx512vl(auVar88,auVar139,local_3b0);
      aVar4 = (ray->org).field_0;
      auVar88 = vsubps_avx(local_550,(undefined1  [16])aVar4);
      uVar134 = auVar88._0_4_;
      auVar150._4_4_ = uVar134;
      auVar150._0_4_ = uVar134;
      auVar150._8_4_ = uVar134;
      auVar150._12_4_ = uVar134;
      auVar89 = vshufps_avx(auVar88,auVar88,0x55);
      aVar5 = (local_5f0->ray_space).vx.field_0;
      aVar6 = (local_5f0->ray_space).vy.field_0;
      fVar158 = (local_5f0->ray_space).vz.field_0.m128[0];
      fVar142 = (local_5f0->ray_space).vz.field_0.m128[1];
      fVar157 = (local_5f0->ray_space).vz.field_0.m128[2];
      fVar163 = (local_5f0->ray_space).vz.field_0.m128[3];
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar188._0_4_ = auVar88._0_4_ * fVar158;
      auVar188._4_4_ = auVar88._4_4_ * fVar142;
      auVar188._8_4_ = auVar88._8_4_ * fVar157;
      auVar188._12_4_ = auVar88._12_4_ * fVar163;
      auVar89 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar6,auVar89);
      auVar82 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar150);
      auVar88 = vsubps_avx(local_3c0,(undefined1  [16])aVar4);
      uVar134 = auVar88._0_4_;
      auVar151._4_4_ = uVar134;
      auVar151._0_4_ = uVar134;
      auVar151._8_4_ = uVar134;
      auVar151._12_4_ = uVar134;
      auVar89 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar190._0_4_ = auVar88._0_4_ * fVar158;
      auVar190._4_4_ = auVar88._4_4_ * fVar142;
      auVar190._8_4_ = auVar88._8_4_ * fVar157;
      auVar190._12_4_ = auVar88._12_4_ * fVar163;
      auVar89 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar6,auVar89);
      auVar21 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar151);
      auVar88 = vsubps_avx(local_3d0,(undefined1  [16])aVar4);
      uVar134 = auVar88._0_4_;
      auVar152._4_4_ = uVar134;
      auVar152._0_4_ = uVar134;
      auVar152._8_4_ = uVar134;
      auVar152._12_4_ = uVar134;
      auVar89 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar191._0_4_ = fVar158 * auVar88._0_4_;
      auVar191._4_4_ = fVar142 * auVar88._4_4_;
      auVar191._8_4_ = fVar157 * auVar88._8_4_;
      auVar191._12_4_ = fVar163 * auVar88._12_4_;
      auVar89 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar89);
      auVar22 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar152);
      auVar88 = vsubps_avx512vl(local_3b0,(undefined1  [16])aVar4);
      uVar134 = auVar88._0_4_;
      auVar146._4_4_ = uVar134;
      auVar146._0_4_ = uVar134;
      auVar146._8_4_ = uVar134;
      auVar146._12_4_ = uVar134;
      auVar89 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar195._0_4_ = auVar88._0_4_ * fVar158;
      auVar195._4_4_ = auVar88._4_4_ * fVar142;
      auVar195._8_4_ = auVar88._8_4_ * fVar157;
      auVar195._12_4_ = auVar88._12_4_ * fVar163;
      auVar89 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar6,auVar89);
      auVar83 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar146);
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar26);
      uVar134 = auVar82._0_4_;
      local_400._4_4_ = uVar134;
      local_400._0_4_ = uVar134;
      local_400._8_4_ = uVar134;
      local_400._12_4_ = uVar134;
      local_400._16_4_ = uVar134;
      local_400._20_4_ = uVar134;
      local_400._24_4_ = uVar134;
      local_400._28_4_ = uVar134;
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x484);
      auVar92._8_4_ = 1;
      auVar92._0_8_ = 0x100000001;
      auVar92._12_4_ = 1;
      auVar92._16_4_ = 1;
      auVar92._20_4_ = 1;
      auVar92._24_4_ = 1;
      auVar92._28_4_ = 1;
      local_340 = vpermps_avx2(auVar92,ZEXT1632(auVar82));
      local_420 = vbroadcastss_avx512vl(auVar21);
      local_360 = vpermps_avx512vl(auVar92,ZEXT1632(auVar21));
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x908);
      local_440 = vbroadcastss_avx512vl(auVar22);
      local_460 = vpermps_avx512vl(auVar92,ZEXT1632(auVar22));
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0xd8c);
      uVar134 = auVar83._0_4_;
      local_380._4_4_ = uVar134;
      local_380._0_4_ = uVar134;
      local_380._8_4_ = uVar134;
      local_380._12_4_ = uVar134;
      local_380._16_4_ = uVar134;
      local_380._20_4_ = uVar134;
      local_380._24_4_ = uVar134;
      local_380._28_4_ = uVar134;
      local_3a0 = vpermps_avx2(auVar92,ZEXT1632(auVar83));
      auVar92 = vmulps_avx512vl(local_380,auVar104);
      auVar93 = vmulps_avx512vl(local_3a0,auVar104);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_440);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar105,local_460);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar109,local_420);
      auVar94 = vfmadd231ps_avx512vl(auVar93,auVar109,local_360);
      auVar95 = vfmadd231ps_avx512vl(auVar92,auVar107,local_400);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar26);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x484);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x908);
      auVar96 = vfmadd231ps_avx512vl(auVar94,auVar107,local_340);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0xd8c);
      auVar205 = ZEXT3264(local_380);
      auVar97 = vmulps_avx512vl(local_380,auVar94);
      auVar206 = ZEXT3264(local_3a0);
      auVar98 = vmulps_avx512vl(local_3a0,auVar94);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_440);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_460);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_420);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_360);
      auVar23 = vfmadd231ps_fma(auVar97,auVar92,local_400);
      auVar24 = vfmadd231ps_fma(auVar98,auVar92,local_340);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar23),auVar95);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar24),auVar96);
      auVar97 = vmulps_avx512vl(auVar96,auVar98);
      auVar100 = vmulps_avx512vl(auVar95,auVar99);
      auVar97 = vsubps_avx512vl(auVar97,auVar100);
      auVar89 = vshufps_avx(local_550,local_550,0xff);
      uVar135 = auVar89._0_8_;
      local_80._8_8_ = uVar135;
      local_80._0_8_ = uVar135;
      local_80._16_8_ = uVar135;
      local_80._24_8_ = uVar135;
      auVar89 = vshufps_avx(local_3c0,local_3c0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar89);
      auVar89 = vshufps_avx(local_3d0,local_3d0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar89);
      auVar89 = vshufps_avx512vl(local_3b0,local_3b0,0xff);
      uVar135 = auVar89._0_8_;
      register0x00001248 = uVar135;
      local_e0 = uVar135;
      register0x00001250 = uVar135;
      register0x00001258 = uVar135;
      auVar100 = vmulps_avx512vl(_local_e0,auVar104);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,local_a0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_80);
      auVar101 = vmulps_avx512vl(_local_e0,auVar94);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_a0);
      auVar84 = vfmadd231ps_fma(auVar101,auVar92,local_80);
      auVar101 = vmulps_avx512vl(auVar99,auVar99);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar98);
      auVar102 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar84));
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      auVar101 = vmulps_avx512vl(auVar102,auVar101);
      auVar97 = vmulps_avx512vl(auVar97,auVar97);
      uVar135 = vcmpps_avx512vl(auVar97,auVar101,2);
      auVar89 = vblendps_avx(auVar82,local_550,8);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar88 = vandps_avx512vl(auVar89,auVar90);
      auVar89 = vblendps_avx(auVar21,local_3c0,8);
      auVar89 = vandps_avx512vl(auVar89,auVar90);
      auVar88 = vmaxps_avx(auVar88,auVar89);
      auVar89 = vblendps_avx(auVar22,local_3d0,8);
      auVar91 = vandps_avx512vl(auVar89,auVar90);
      auVar89 = vblendps_avx(auVar83,local_3b0,8);
      auVar89 = vandps_avx512vl(auVar89,auVar90);
      auVar89 = vmaxps_avx(auVar91,auVar89);
      auVar89 = vmaxps_avx(auVar88,auVar89);
      auVar88 = vmovshdup_avx(auVar89);
      auVar88 = vmaxss_avx(auVar88,auVar89);
      auVar89 = vshufpd_avx(auVar89,auVar89,1);
      auVar89 = vmaxss_avx(auVar89,auVar88);
      _local_300 = vcvtsi2ss_avx512f(local_3b0,iVar8);
      auVar101._0_4_ = local_300._0_4_;
      auVar101._4_4_ = auVar101._0_4_;
      auVar101._8_4_ = auVar101._0_4_;
      auVar101._12_4_ = auVar101._0_4_;
      auVar101._16_4_ = auVar101._0_4_;
      auVar101._20_4_ = auVar101._0_4_;
      auVar101._24_4_ = auVar101._0_4_;
      auVar101._28_4_ = auVar101._0_4_;
      uVar25 = vcmpps_avx512vl(auVar101,_DAT_02020f40,0xe);
      local_230 = (byte)uVar135 & (byte)uVar25;
      fVar142 = auVar89._0_4_ * 4.7683716e-07;
      auVar97._8_4_ = 2;
      auVar97._0_8_ = 0x200000002;
      auVar97._12_4_ = 2;
      auVar97._16_4_ = 2;
      auVar97._20_4_ = 2;
      auVar97._24_4_ = 2;
      auVar97._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar97,ZEXT1632(auVar82));
      local_120 = vpermps_avx512vl(auVar97,ZEXT1632(auVar21));
      local_140 = vpermps_avx512vl(auVar97,ZEXT1632(auVar22));
      auVar97 = vpermps_avx2(auVar97,ZEXT1632(auVar83));
      fVar158 = *(float *)((long)&(ray->org).field_0 + 0xc);
      auVar88 = auVar99._0_16_;
      auVar89 = ZEXT416((uint)fVar142);
      context = local_618;
      if (local_230 == 0) {
        bVar77 = false;
        auVar89 = vxorps_avx512vl(auVar88,auVar88);
        auVar202 = ZEXT1664(auVar89);
        auVar199 = ZEXT3264(local_400);
        auVar200 = ZEXT3264(local_340);
        auVar201 = ZEXT3264(local_420);
        auVar207 = ZEXT3264(local_360);
        auVar203 = ZEXT3264(local_440);
        auVar204 = ZEXT3264(local_460);
      }
      else {
        fStack_4dc = 0.0;
        fStack_4d8 = 0.0;
        fStack_4d4 = 0.0;
        auVar94 = vmulps_avx512vl(auVar97,auVar94);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_140,auVar94);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar103);
        auVar102 = vfmadd213ps_avx512vl(auVar92,local_100,auVar93);
        auVar104 = vmulps_avx512vl(auVar97,auVar104);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar104);
        auVar93 = vfmadd213ps_avx512vl(auVar109,local_120,auVar105);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1694);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1f9c);
        auVar106 = vfmadd213ps_avx512vl(auVar107,local_100,auVar93);
        auVar107 = vmulps_avx512vl(local_380,auVar92);
        auVar93 = vmulps_avx512vl(local_3a0,auVar92);
        auVar192._0_4_ = auVar97._0_4_ * auVar92._0_4_;
        auVar192._4_4_ = auVar97._4_4_ * auVar92._4_4_;
        auVar192._8_4_ = auVar97._8_4_ * auVar92._8_4_;
        auVar192._12_4_ = auVar97._12_4_ * auVar92._12_4_;
        auVar192._16_4_ = auVar97._16_4_ * auVar92._16_4_;
        auVar192._20_4_ = auVar97._20_4_ * auVar92._20_4_;
        auVar192._24_4_ = auVar97._24_4_ * auVar92._24_4_;
        auVar192._28_4_ = 0;
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,local_440);
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar104,local_460);
        auVar104 = vfmadd231ps_avx512vl(auVar192,local_140,auVar104);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_420);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_360);
        auVar93 = vfmadd231ps_avx512vl(auVar104,local_120,auVar105);
        auVar103 = vfmadd231ps_avx512vl(auVar107,auVar109,local_400);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar109,local_340);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1f9c);
        auVar93 = vfmadd231ps_avx512vl(auVar93,local_100,auVar109);
        auVar94 = vmulps_avx512vl(local_380,auVar104);
        auVar108 = vmulps_avx512vl(local_3a0,auVar104);
        auVar109._4_4_ = auVar97._4_4_ * auVar104._4_4_;
        auVar109._0_4_ = auVar97._0_4_ * auVar104._0_4_;
        auVar109._8_4_ = auVar97._8_4_ * auVar104._8_4_;
        auVar109._12_4_ = auVar97._12_4_ * auVar104._12_4_;
        auVar109._16_4_ = auVar97._16_4_ * auVar104._16_4_;
        auVar109._20_4_ = auVar97._20_4_ * auVar104._20_4_;
        auVar109._24_4_ = auVar97._24_4_ * auVar104._24_4_;
        auVar109._28_4_ = auVar104._28_4_;
        auVar104 = vfmadd231ps_avx512vl(auVar94,auVar105,local_440);
        auVar94 = vfmadd231ps_avx512vl(auVar108,auVar105,local_460);
        auVar105 = vfmadd231ps_avx512vl(auVar109,local_140,auVar105);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1694);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_420);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_360);
        auVar109 = vfmadd231ps_avx512vl(auVar105,local_120,auVar109);
        auVar105 = vfmadd231ps_avx512vl(auVar104,auVar107,local_400);
        auVar104 = vfmadd231ps_avx512vl(auVar94,auVar107,local_340);
        auVar94 = vfmadd231ps_avx512vl(auVar109,local_100,auVar107);
        auVar196._8_4_ = 0x7fffffff;
        auVar196._0_8_ = 0x7fffffff7fffffff;
        auVar196._12_4_ = 0x7fffffff;
        auVar196._16_4_ = 0x7fffffff;
        auVar196._20_4_ = 0x7fffffff;
        auVar196._24_4_ = 0x7fffffff;
        auVar196._28_4_ = 0x7fffffff;
        auVar107 = vandps_avx(auVar103,auVar196);
        auVar109 = vandps_avx(auVar92,auVar196);
        auVar109 = vmaxps_avx(auVar107,auVar109);
        auVar107 = vandps_avx(auVar93,auVar196);
        auVar107 = vmaxps_avx(auVar109,auVar107);
        auVar93 = vbroadcastss_avx512vl(auVar89);
        uVar70 = vcmpps_avx512vl(auVar107,auVar93,1);
        bVar77 = (bool)((byte)uVar70 & 1);
        auVar108._0_4_ = (float)((uint)bVar77 * auVar98._0_4_ | (uint)!bVar77 * auVar103._0_4_);
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar103._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar103._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar103._12_4_);
        bVar77 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar103._16_4_);
        bVar77 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar103._20_4_);
        bVar77 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar103._24_4_);
        bVar77 = SUB81(uVar70 >> 7,0);
        auVar108._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar103._28_4_;
        bVar77 = (bool)((byte)uVar70 & 1);
        auVar110._0_4_ = (float)((uint)bVar77 * auVar99._0_4_ | (uint)!bVar77 * auVar92._0_4_);
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar77 * auVar99._4_4_ | (uint)!bVar77 * auVar92._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar77 * auVar99._8_4_ | (uint)!bVar77 * auVar92._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar77 * auVar99._12_4_ | (uint)!bVar77 * auVar92._12_4_);
        bVar77 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar77 * auVar99._16_4_ | (uint)!bVar77 * auVar92._16_4_);
        bVar77 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar77 * auVar99._20_4_ | (uint)!bVar77 * auVar92._20_4_);
        bVar77 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar77 * auVar99._24_4_ | (uint)!bVar77 * auVar92._24_4_);
        bVar77 = SUB81(uVar70 >> 7,0);
        auVar110._28_4_ = (uint)bVar77 * auVar99._28_4_ | (uint)!bVar77 * auVar92._28_4_;
        auVar107 = vandps_avx(auVar196,auVar105);
        auVar109 = vandps_avx(auVar104,auVar196);
        auVar109 = vmaxps_avx(auVar107,auVar109);
        auVar107 = vandps_avx(auVar94,auVar196);
        auVar107 = vmaxps_avx(auVar109,auVar107);
        uVar70 = vcmpps_avx512vl(auVar107,auVar93,1);
        bVar77 = (bool)((byte)uVar70 & 1);
        auVar111._0_4_ = (float)((uint)bVar77 * auVar98._0_4_ | (uint)!bVar77 * auVar105._0_4_);
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar105._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar105._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar105._12_4_);
        bVar77 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar105._16_4_);
        bVar77 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar105._20_4_);
        bVar77 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar105._24_4_);
        bVar77 = SUB81(uVar70 >> 7,0);
        auVar111._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar105._28_4_;
        bVar77 = (bool)((byte)uVar70 & 1);
        auVar112._0_4_ = (float)((uint)bVar77 * auVar99._0_4_ | (uint)!bVar77 * auVar104._0_4_);
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar77 * auVar99._4_4_ | (uint)!bVar77 * auVar104._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar77 * auVar99._8_4_ | (uint)!bVar77 * auVar104._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar77 * auVar99._12_4_ | (uint)!bVar77 * auVar104._12_4_);
        bVar77 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar77 * auVar99._16_4_ | (uint)!bVar77 * auVar104._16_4_);
        bVar77 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar77 * auVar99._20_4_ | (uint)!bVar77 * auVar104._20_4_);
        bVar77 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar77 * auVar99._24_4_ | (uint)!bVar77 * auVar104._24_4_);
        bVar77 = SUB81(uVar70 >> 7,0);
        auVar112._28_4_ = (uint)bVar77 * auVar99._28_4_ | (uint)!bVar77 * auVar104._28_4_;
        auVar81 = vxorps_avx512vl(auVar88,auVar88);
        auVar202 = ZEXT1664(auVar81);
        auVar107 = vfmadd213ps_avx512vl(auVar108,auVar108,ZEXT1632(auVar81));
        auVar88 = vfmadd231ps_fma(auVar107,auVar110,auVar110);
        auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
        fVar157 = auVar109._0_4_;
        fVar163 = auVar109._4_4_;
        fVar170 = auVar109._8_4_;
        fVar171 = auVar109._12_4_;
        fVar172 = auVar109._16_4_;
        fVar162 = auVar109._20_4_;
        fVar79 = auVar109._24_4_;
        auVar107._4_4_ = fVar163 * fVar163 * fVar163 * auVar88._4_4_ * -0.5;
        auVar107._0_4_ = fVar157 * fVar157 * fVar157 * auVar88._0_4_ * -0.5;
        auVar107._8_4_ = fVar170 * fVar170 * fVar170 * auVar88._8_4_ * -0.5;
        auVar107._12_4_ = fVar171 * fVar171 * fVar171 * auVar88._12_4_ * -0.5;
        auVar107._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar107._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar107._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
        auVar107._28_4_ = auVar94._28_4_;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar92,auVar109);
        auVar105._4_4_ = auVar110._4_4_ * auVar107._4_4_;
        auVar105._0_4_ = auVar110._0_4_ * auVar107._0_4_;
        auVar105._8_4_ = auVar110._8_4_ * auVar107._8_4_;
        auVar105._12_4_ = auVar110._12_4_ * auVar107._12_4_;
        auVar105._16_4_ = auVar110._16_4_ * auVar107._16_4_;
        auVar105._20_4_ = auVar110._20_4_ * auVar107._20_4_;
        auVar105._24_4_ = auVar110._24_4_ * auVar107._24_4_;
        auVar105._28_4_ = 0;
        auVar104._4_4_ = auVar107._4_4_ * -auVar108._4_4_;
        auVar104._0_4_ = auVar107._0_4_ * -auVar108._0_4_;
        auVar104._8_4_ = auVar107._8_4_ * -auVar108._8_4_;
        auVar104._12_4_ = auVar107._12_4_ * -auVar108._12_4_;
        auVar104._16_4_ = auVar107._16_4_ * -auVar108._16_4_;
        auVar104._20_4_ = auVar107._20_4_ * -auVar108._20_4_;
        auVar104._24_4_ = auVar107._24_4_ * -auVar108._24_4_;
        auVar104._28_4_ = auVar110._28_4_;
        auVar107 = vmulps_avx512vl(auVar107,ZEXT1632(auVar81));
        auVar98 = ZEXT1632(auVar81);
        auVar109 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar98);
        auVar88 = vfmadd231ps_fma(auVar109,auVar112,auVar112);
        auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
        fVar157 = auVar109._0_4_;
        fVar163 = auVar109._4_4_;
        fVar170 = auVar109._8_4_;
        fVar171 = auVar109._12_4_;
        fVar172 = auVar109._16_4_;
        fVar162 = auVar109._20_4_;
        fVar79 = auVar109._24_4_;
        auVar93._4_4_ = fVar163 * fVar163 * fVar163 * auVar88._4_4_ * -0.5;
        auVar93._0_4_ = fVar157 * fVar157 * fVar157 * auVar88._0_4_ * -0.5;
        auVar93._8_4_ = fVar170 * fVar170 * fVar170 * auVar88._8_4_ * -0.5;
        auVar93._12_4_ = fVar171 * fVar171 * fVar171 * auVar88._12_4_ * -0.5;
        auVar93._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar93._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar93._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
        auVar93._28_4_ = 0;
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar109);
        auVar103._4_4_ = auVar112._4_4_ * auVar92._4_4_;
        auVar103._0_4_ = auVar112._0_4_ * auVar92._0_4_;
        auVar103._8_4_ = auVar112._8_4_ * auVar92._8_4_;
        auVar103._12_4_ = auVar112._12_4_ * auVar92._12_4_;
        auVar103._16_4_ = auVar112._16_4_ * auVar92._16_4_;
        auVar103._20_4_ = auVar112._20_4_ * auVar92._20_4_;
        auVar103._24_4_ = auVar112._24_4_ * auVar92._24_4_;
        auVar103._28_4_ = auVar109._28_4_;
        auVar94._4_4_ = -auVar111._4_4_ * auVar92._4_4_;
        auVar94._0_4_ = -auVar111._0_4_ * auVar92._0_4_;
        auVar94._8_4_ = -auVar111._8_4_ * auVar92._8_4_;
        auVar94._12_4_ = -auVar111._12_4_ * auVar92._12_4_;
        auVar94._16_4_ = -auVar111._16_4_ * auVar92._16_4_;
        auVar94._20_4_ = -auVar111._20_4_ * auVar92._20_4_;
        auVar94._24_4_ = -auVar111._24_4_ * auVar92._24_4_;
        auVar94._28_4_ = auVar111._28_4_ ^ 0x80000000;
        auVar109 = vmulps_avx512vl(auVar92,auVar98);
        auVar88 = vfmadd213ps_fma(auVar105,auVar100,auVar95);
        auVar82 = vfmadd213ps_fma(auVar104,auVar100,auVar96);
        auVar92 = vfmadd213ps_avx512vl(auVar107,auVar100,auVar106);
        auVar93 = vfmadd213ps_avx512vl(auVar103,ZEXT1632(auVar84),ZEXT1632(auVar23));
        auVar90 = vfnmadd213ps_fma(auVar105,auVar100,auVar95);
        auVar95 = ZEXT1632(auVar84);
        auVar21 = vfmadd213ps_fma(auVar94,auVar95,ZEXT1632(auVar24));
        auVar91 = vfnmadd213ps_fma(auVar104,auVar100,auVar96);
        auVar22 = vfmadd213ps_fma(auVar109,auVar95,auVar102);
        auVar105 = vfnmadd231ps_avx512vl(auVar106,auVar100,auVar107);
        auVar28 = vfnmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar23));
        auVar24 = vfnmadd213ps_fma(auVar94,auVar95,ZEXT1632(auVar24));
        auVar29 = vfnmadd231ps_fma(auVar102,ZEXT1632(auVar84),auVar109);
        auVar109 = vsubps_avx512vl(auVar93,ZEXT1632(auVar90));
        auVar107 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar91));
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar22),auVar105);
        auVar103 = vmulps_avx512vl(auVar107,auVar105);
        auVar83 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar91),auVar104);
        auVar95._4_4_ = auVar90._4_4_ * auVar104._4_4_;
        auVar95._0_4_ = auVar90._0_4_ * auVar104._0_4_;
        auVar95._8_4_ = auVar90._8_4_ * auVar104._8_4_;
        auVar95._12_4_ = auVar90._12_4_ * auVar104._12_4_;
        auVar95._16_4_ = auVar104._16_4_ * 0.0;
        auVar95._20_4_ = auVar104._20_4_ * 0.0;
        auVar95._24_4_ = auVar104._24_4_ * 0.0;
        auVar95._28_4_ = auVar104._28_4_;
        auVar104 = vfmsub231ps_avx512vl(auVar95,auVar105,auVar109);
        auVar96._4_4_ = auVar91._4_4_ * auVar109._4_4_;
        auVar96._0_4_ = auVar91._0_4_ * auVar109._0_4_;
        auVar96._8_4_ = auVar91._8_4_ * auVar109._8_4_;
        auVar96._12_4_ = auVar91._12_4_ * auVar109._12_4_;
        auVar96._16_4_ = auVar109._16_4_ * 0.0;
        auVar96._20_4_ = auVar109._20_4_ * 0.0;
        auVar96._24_4_ = auVar109._24_4_ * 0.0;
        auVar96._28_4_ = auVar109._28_4_;
        auVar23 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar90),auVar107);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar98,auVar104);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,ZEXT1632(auVar83));
        auVar108 = ZEXT1632(auVar81);
        uVar70 = vcmpps_avx512vl(auVar107,auVar108,2);
        bVar13 = (byte)uVar70;
        fVar79 = (float)((uint)(bVar13 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar28._0_4_);
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar127 = (float)((uint)bVar77 * auVar88._4_4_ | (uint)!bVar77 * auVar28._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar129 = (float)((uint)bVar77 * auVar88._8_4_ | (uint)!bVar77 * auVar28._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar131 = (float)((uint)bVar77 * auVar88._12_4_ | (uint)!bVar77 * auVar28._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar79))));
        fVar80 = (float)((uint)(bVar13 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar24._0_4_);
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar128 = (float)((uint)bVar77 * auVar82._4_4_ | (uint)!bVar77 * auVar24._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar130 = (float)((uint)bVar77 * auVar82._8_4_ | (uint)!bVar77 * auVar24._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar132 = (float)((uint)bVar77 * auVar82._12_4_ | (uint)!bVar77 * auVar24._12_4_);
        auVar94 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar80))));
        auVar106._0_4_ =
             (float)((uint)(bVar13 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar29._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar77 * auVar92._4_4_ | (uint)!bVar77 * auVar29._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar77 * auVar92._8_4_ | (uint)!bVar77 * auVar29._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar77 * auVar92._12_4_ | (uint)!bVar77 * auVar29._12_4_);
        fVar157 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_);
        auVar106._16_4_ = fVar157;
        fVar163 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_);
        auVar106._20_4_ = fVar163;
        fVar170 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_);
        auVar106._24_4_ = fVar170;
        iVar1 = (uint)(byte)(uVar70 >> 7) * auVar92._28_4_;
        auVar106._28_4_ = iVar1;
        auVar109 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar93);
        auVar113._0_4_ =
             (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar83._0_4_;
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar77 * auVar109._4_4_ | (uint)!bVar77 * auVar83._4_4_;
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar77 * auVar109._8_4_ | (uint)!bVar77 * auVar83._8_4_;
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar77 * auVar109._12_4_ | (uint)!bVar77 * auVar83._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar109._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar109._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar109._24_4_;
        auVar113._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar109._28_4_;
        auVar109 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar21));
        auVar114._0_4_ =
             (float)((uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar82._0_4_
                    );
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar77 * auVar109._4_4_ | (uint)!bVar77 * auVar82._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar77 * auVar109._8_4_ | (uint)!bVar77 * auVar82._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar77 * auVar109._12_4_ | (uint)!bVar77 * auVar82._12_4_);
        fVar171 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar109._16_4_);
        auVar114._16_4_ = fVar171;
        fVar172 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar109._20_4_);
        auVar114._20_4_ = fVar172;
        fVar162 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar109._24_4_);
        auVar114._24_4_ = fVar162;
        auVar114._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar109._28_4_;
        auVar109 = vblendmps_avx512vl(auVar105,ZEXT1632(auVar22));
        auVar115._0_4_ =
             (float)((uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar92._0_4_
                    );
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar77 * auVar109._4_4_ | (uint)!bVar77 * auVar92._4_4_);
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar77 * auVar109._8_4_ | (uint)!bVar77 * auVar92._8_4_);
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar77 * auVar109._12_4_ | (uint)!bVar77 * auVar92._12_4_);
        bVar77 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar77 * auVar109._16_4_ | (uint)!bVar77 * auVar92._16_4_);
        bVar77 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar77 * auVar109._20_4_ | (uint)!bVar77 * auVar92._20_4_);
        bVar77 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar77 * auVar109._24_4_ | (uint)!bVar77 * auVar92._24_4_);
        bVar77 = SUB81(uVar70 >> 7,0);
        auVar115._28_4_ = (uint)bVar77 * auVar109._28_4_ | (uint)!bVar77 * auVar92._28_4_;
        auVar116._0_4_ =
             (uint)(bVar13 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar93._0_4_;
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar77 * (int)auVar90._4_4_ | (uint)!bVar77 * auVar93._4_4_;
        bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar77 * (int)auVar90._8_4_ | (uint)!bVar77 * auVar93._8_4_;
        bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar77 * (int)auVar90._12_4_ | (uint)!bVar77 * auVar93._12_4_;
        auVar116._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar93._16_4_;
        auVar116._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar93._20_4_;
        auVar116._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar93._24_4_;
        auVar116._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar93._28_4_;
        bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar117._0_4_ =
             (uint)(bVar13 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar22._0_4_;
        bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar22._4_4_;
        bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar22._8_4_;
        bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar22._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar105._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar105._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar105._24_4_;
        iVar2 = (uint)(byte)(uVar70 >> 7) * auVar105._28_4_;
        auVar117._28_4_ = iVar2;
        auVar95 = vsubps_avx512vl(auVar116,auVar103);
        auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar91._12_4_ |
                                                 (uint)!bVar16 * auVar21._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar91._8_4_ |
                                                          (uint)!bVar15 * auVar21._8_4_,
                                                          CONCAT44((uint)bVar77 * (int)auVar91._4_4_
                                                                   | (uint)!bVar77 * auVar21._4_4_,
                                                                   (uint)(bVar13 & 1) *
                                                                   (int)auVar91._0_4_ |
                                                                   (uint)!(bool)(bVar13 & 1) *
                                                                   auVar21._0_4_)))),auVar94);
        auVar105 = vsubps_avx(auVar117,auVar106);
        auVar104 = vsubps_avx(auVar103,auVar113);
        auVar92 = vsubps_avx(auVar94,auVar114);
        auVar93 = vsubps_avx(auVar106,auVar115);
        auVar98._4_4_ = auVar105._4_4_ * fVar127;
        auVar98._0_4_ = auVar105._0_4_ * fVar79;
        auVar98._8_4_ = auVar105._8_4_ * fVar129;
        auVar98._12_4_ = auVar105._12_4_ * fVar131;
        auVar98._16_4_ = auVar105._16_4_ * 0.0;
        auVar98._20_4_ = auVar105._20_4_ * 0.0;
        auVar98._24_4_ = auVar105._24_4_ * 0.0;
        auVar98._28_4_ = iVar2;
        auVar88 = vfmsub231ps_fma(auVar98,auVar106,auVar95);
        auVar99._4_4_ = fVar128 * auVar95._4_4_;
        auVar99._0_4_ = fVar80 * auVar95._0_4_;
        auVar99._8_4_ = fVar130 * auVar95._8_4_;
        auVar99._12_4_ = fVar132 * auVar95._12_4_;
        auVar99._16_4_ = auVar95._16_4_ * 0.0;
        auVar99._20_4_ = auVar95._20_4_ * 0.0;
        auVar99._24_4_ = auVar95._24_4_ * 0.0;
        auVar99._28_4_ = auVar107._28_4_;
        auVar82 = vfmsub231ps_fma(auVar99,auVar103,auVar109);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar108,ZEXT1632(auVar88));
        auVar166._0_4_ = auVar109._0_4_ * auVar106._0_4_;
        auVar166._4_4_ = auVar109._4_4_ * auVar106._4_4_;
        auVar166._8_4_ = auVar109._8_4_ * auVar106._8_4_;
        auVar166._12_4_ = auVar109._12_4_ * auVar106._12_4_;
        auVar166._16_4_ = auVar109._16_4_ * fVar157;
        auVar166._20_4_ = auVar109._20_4_ * fVar163;
        auVar166._24_4_ = auVar109._24_4_ * fVar170;
        auVar166._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar166,auVar94,auVar105);
        auVar96 = vfmadd231ps_avx512vl(auVar107,auVar108,ZEXT1632(auVar88));
        auVar107 = vmulps_avx512vl(auVar93,auVar113);
        auVar107 = vfmsub231ps_avx512vl(auVar107,auVar104,auVar115);
        auVar102._4_4_ = auVar92._4_4_ * auVar115._4_4_;
        auVar102._0_4_ = auVar92._0_4_ * auVar115._0_4_;
        auVar102._8_4_ = auVar92._8_4_ * auVar115._8_4_;
        auVar102._12_4_ = auVar92._12_4_ * auVar115._12_4_;
        auVar102._16_4_ = auVar92._16_4_ * auVar115._16_4_;
        auVar102._20_4_ = auVar92._20_4_ * auVar115._20_4_;
        auVar102._24_4_ = auVar92._24_4_ * auVar115._24_4_;
        auVar102._28_4_ = auVar115._28_4_;
        auVar88 = vfmsub231ps_fma(auVar102,auVar114,auVar93);
        auVar167._0_4_ = auVar114._0_4_ * auVar104._0_4_;
        auVar167._4_4_ = auVar114._4_4_ * auVar104._4_4_;
        auVar167._8_4_ = auVar114._8_4_ * auVar104._8_4_;
        auVar167._12_4_ = auVar114._12_4_ * auVar104._12_4_;
        auVar167._16_4_ = fVar171 * auVar104._16_4_;
        auVar167._20_4_ = fVar172 * auVar104._20_4_;
        auVar167._24_4_ = fVar162 * auVar104._24_4_;
        auVar167._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar167,auVar92,auVar113);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar108,auVar107);
        auVar98 = vfmadd231ps_avx512vl(auVar107,auVar108,ZEXT1632(auVar88));
        auVar107 = vmaxps_avx(auVar96,auVar98);
        uVar135 = vcmpps_avx512vl(auVar107,auVar108,2);
        local_230 = local_230 & (byte)uVar135;
        auVar199 = ZEXT3264(local_400);
        auVar200 = ZEXT3264(local_340);
        auVar201 = ZEXT3264(local_420);
        auVar207 = ZEXT3264(local_360);
        auVar203 = ZEXT3264(local_440);
        auVar204 = ZEXT3264(local_460);
        auVar205 = ZEXT3264(local_380);
        auVar194 = ZEXT1664(auVar89);
        if (local_230 == 0) {
          local_230 = 0;
        }
        else {
          auVar39._4_4_ = auVar93._4_4_ * auVar109._4_4_;
          auVar39._0_4_ = auVar93._0_4_ * auVar109._0_4_;
          auVar39._8_4_ = auVar93._8_4_ * auVar109._8_4_;
          auVar39._12_4_ = auVar93._12_4_ * auVar109._12_4_;
          auVar39._16_4_ = auVar93._16_4_ * auVar109._16_4_;
          auVar39._20_4_ = auVar93._20_4_ * auVar109._20_4_;
          auVar39._24_4_ = auVar93._24_4_ * auVar109._24_4_;
          auVar39._28_4_ = auVar107._28_4_;
          auVar21 = vfmsub231ps_fma(auVar39,auVar92,auVar105);
          auVar40._4_4_ = auVar105._4_4_ * auVar104._4_4_;
          auVar40._0_4_ = auVar105._0_4_ * auVar104._0_4_;
          auVar40._8_4_ = auVar105._8_4_ * auVar104._8_4_;
          auVar40._12_4_ = auVar105._12_4_ * auVar104._12_4_;
          auVar40._16_4_ = auVar105._16_4_ * auVar104._16_4_;
          auVar40._20_4_ = auVar105._20_4_ * auVar104._20_4_;
          auVar40._24_4_ = auVar105._24_4_ * auVar104._24_4_;
          auVar40._28_4_ = auVar105._28_4_;
          auVar82 = vfmsub231ps_fma(auVar40,auVar95,auVar93);
          auVar41._4_4_ = auVar92._4_4_ * auVar95._4_4_;
          auVar41._0_4_ = auVar92._0_4_ * auVar95._0_4_;
          auVar41._8_4_ = auVar92._8_4_ * auVar95._8_4_;
          auVar41._12_4_ = auVar92._12_4_ * auVar95._12_4_;
          auVar41._16_4_ = auVar92._16_4_ * auVar95._16_4_;
          auVar41._20_4_ = auVar92._20_4_ * auVar95._20_4_;
          auVar41._24_4_ = auVar92._24_4_ * auVar95._24_4_;
          auVar41._28_4_ = auVar92._28_4_;
          auVar22 = vfmsub231ps_fma(auVar41,auVar104,auVar109);
          auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar22));
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar21),auVar108);
          auVar109 = vrcp14ps_avx512vl(auVar107);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = &DAT_3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar105 = vfnmadd213ps_avx512vl(auVar109,auVar107,auVar32);
          auVar88 = vfmadd132ps_fma(auVar105,auVar109,auVar109);
          auVar42._4_4_ = auVar22._4_4_ * auVar106._4_4_;
          auVar42._0_4_ = auVar22._0_4_ * auVar106._0_4_;
          auVar42._8_4_ = auVar22._8_4_ * auVar106._8_4_;
          auVar42._12_4_ = auVar22._12_4_ * auVar106._12_4_;
          auVar42._16_4_ = fVar157 * 0.0;
          auVar42._20_4_ = fVar163 * 0.0;
          auVar42._24_4_ = fVar170 * 0.0;
          auVar42._28_4_ = iVar1;
          auVar82 = vfmadd231ps_fma(auVar42,auVar94,ZEXT1632(auVar82));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar103,ZEXT1632(auVar21));
          fVar163 = auVar88._0_4_;
          fVar170 = auVar88._4_4_;
          fVar171 = auVar88._8_4_;
          fVar172 = auVar88._12_4_;
          auVar109 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar172,
                                        CONCAT48(auVar82._8_4_ * fVar171,
                                                 CONCAT44(auVar82._4_4_ * fVar170,
                                                          auVar82._0_4_ * fVar163))));
          auVar183._4_4_ = fVar158;
          auVar183._0_4_ = fVar158;
          auVar183._8_4_ = fVar158;
          auVar183._12_4_ = fVar158;
          auVar183._16_4_ = fVar158;
          auVar183._20_4_ = fVar158;
          auVar183._24_4_ = fVar158;
          auVar183._28_4_ = fVar158;
          uVar135 = vcmpps_avx512vl(auVar183,auVar109,2);
          fVar157 = ray->tfar;
          auVar33._4_4_ = fVar157;
          auVar33._0_4_ = fVar157;
          auVar33._8_4_ = fVar157;
          auVar33._12_4_ = fVar157;
          auVar33._16_4_ = fVar157;
          auVar33._20_4_ = fVar157;
          auVar33._24_4_ = fVar157;
          auVar33._28_4_ = fVar157;
          uVar25 = vcmpps_avx512vl(auVar109,auVar33,2);
          local_230 = (byte)uVar135 & (byte)uVar25 & local_230;
          if (local_230 != 0) {
            uVar135 = vcmpps_avx512vl(auVar107,auVar108,4);
            if ((local_230 & (byte)uVar135) != 0) {
              local_230 = local_230 & (byte)uVar135;
              fVar157 = auVar96._0_4_ * fVar163;
              fVar162 = auVar96._4_4_ * fVar170;
              auVar43._4_4_ = fVar162;
              auVar43._0_4_ = fVar157;
              fVar79 = auVar96._8_4_ * fVar171;
              auVar43._8_4_ = fVar79;
              fVar80 = auVar96._12_4_ * fVar172;
              auVar43._12_4_ = fVar80;
              fVar127 = auVar96._16_4_ * 0.0;
              auVar43._16_4_ = fVar127;
              fVar128 = auVar96._20_4_ * 0.0;
              auVar43._20_4_ = fVar128;
              fVar129 = auVar96._24_4_ * 0.0;
              auVar43._24_4_ = fVar129;
              auVar43._28_4_ = auVar96._28_4_;
              fVar163 = auVar98._0_4_ * fVar163;
              fVar170 = auVar98._4_4_ * fVar170;
              auVar44._4_4_ = fVar170;
              auVar44._0_4_ = fVar163;
              fVar171 = auVar98._8_4_ * fVar171;
              auVar44._8_4_ = fVar171;
              fVar172 = auVar98._12_4_ * fVar172;
              auVar44._12_4_ = fVar172;
              fVar130 = auVar98._16_4_ * 0.0;
              auVar44._16_4_ = fVar130;
              fVar131 = auVar98._20_4_ * 0.0;
              auVar44._20_4_ = fVar131;
              fVar132 = auVar98._24_4_ * 0.0;
              auVar44._24_4_ = fVar132;
              auVar44._28_4_ = auVar98._28_4_;
              auVar177._8_4_ = 0x3f800000;
              auVar177._0_8_ = &DAT_3f8000003f800000;
              auVar177._12_4_ = 0x3f800000;
              auVar177._16_4_ = 0x3f800000;
              auVar177._20_4_ = 0x3f800000;
              auVar177._24_4_ = 0x3f800000;
              auVar177._28_4_ = 0x3f800000;
              auVar107 = vsubps_avx(auVar177,auVar43);
              local_480._0_4_ =
                   (uint)(bVar13 & 1) * (int)fVar157 | (uint)!(bool)(bVar13 & 1) * auVar107._0_4_;
              bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
              local_480._4_4_ = (uint)bVar77 * (int)fVar162 | (uint)!bVar77 * auVar107._4_4_;
              bVar77 = (bool)((byte)(uVar70 >> 2) & 1);
              local_480._8_4_ = (uint)bVar77 * (int)fVar79 | (uint)!bVar77 * auVar107._8_4_;
              bVar77 = (bool)((byte)(uVar70 >> 3) & 1);
              local_480._12_4_ = (uint)bVar77 * (int)fVar80 | (uint)!bVar77 * auVar107._12_4_;
              bVar77 = (bool)((byte)(uVar70 >> 4) & 1);
              local_480._16_4_ = (uint)bVar77 * (int)fVar127 | (uint)!bVar77 * auVar107._16_4_;
              bVar77 = (bool)((byte)(uVar70 >> 5) & 1);
              local_480._20_4_ = (uint)bVar77 * (int)fVar128 | (uint)!bVar77 * auVar107._20_4_;
              bVar77 = (bool)((byte)(uVar70 >> 6) & 1);
              local_480._24_4_ = (uint)bVar77 * (int)fVar129 | (uint)!bVar77 * auVar107._24_4_;
              bVar77 = SUB81(uVar70 >> 7,0);
              local_480._28_4_ = (uint)bVar77 * auVar96._28_4_ | (uint)!bVar77 * auVar107._28_4_;
              auVar107 = vsubps_avx(auVar177,auVar44);
              bVar77 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar19 = SUB81(uVar70 >> 7,0);
              local_1a0._4_4_ = (uint)bVar77 * (int)fVar170 | (uint)!bVar77 * auVar107._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar13 & 1) * (int)fVar163 | (uint)!(bool)(bVar13 & 1) * auVar107._0_4_;
              local_1a0._8_4_ = (uint)bVar14 * (int)fVar171 | (uint)!bVar14 * auVar107._8_4_;
              local_1a0._12_4_ = (uint)bVar15 * (int)fVar172 | (uint)!bVar15 * auVar107._12_4_;
              local_1a0._16_4_ = (uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar107._16_4_;
              local_1a0._20_4_ = (uint)bVar17 * (int)fVar131 | (uint)!bVar17 * auVar107._20_4_;
              local_1a0._24_4_ = (uint)bVar18 * (int)fVar132 | (uint)!bVar18 * auVar107._24_4_;
              local_1a0._28_4_ = (uint)bVar19 * auVar98._28_4_ | (uint)!bVar19 * auVar107._28_4_;
              local_4a0 = auVar109;
              goto LAB_01c7fe3c;
            }
          }
          local_230 = 0;
        }
LAB_01c7fe3c:
        auVar198 = ZEXT3264(auVar97);
        if (local_230 != 0) {
          auVar107 = vsubps_avx(ZEXT1632(auVar84),auVar100);
          auVar88 = vfmadd213ps_fma(auVar107,local_480,auVar100);
          fVar157 = local_5f0->depth_scale;
          auVar100._4_4_ = fVar157;
          auVar100._0_4_ = fVar157;
          auVar100._8_4_ = fVar157;
          auVar100._12_4_ = fVar157;
          auVar100._16_4_ = fVar157;
          auVar100._20_4_ = fVar157;
          auVar100._24_4_ = fVar157;
          auVar100._28_4_ = fVar157;
          auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                        CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                 CONCAT44(auVar88._4_4_ +
                                                                          auVar88._4_4_,
                                                                          auVar88._0_4_ +
                                                                          auVar88._0_4_)))),auVar100
                                    );
          uVar135 = vcmpps_avx512vl(local_4a0,auVar107,6);
          local_230 = local_230 & (byte)uVar135;
          if (local_230 != 0) {
            auVar140._8_4_ = 0xbf800000;
            auVar140._0_8_ = 0xbf800000bf800000;
            auVar140._12_4_ = 0xbf800000;
            auVar140._16_4_ = 0xbf800000;
            auVar140._20_4_ = 0xbf800000;
            auVar140._24_4_ = 0xbf800000;
            auVar140._28_4_ = 0xbf800000;
            auVar34._8_4_ = 0x40000000;
            auVar34._0_8_ = 0x4000000040000000;
            auVar34._12_4_ = 0x40000000;
            auVar34._16_4_ = 0x40000000;
            auVar34._20_4_ = 0x40000000;
            auVar34._24_4_ = 0x40000000;
            auVar34._28_4_ = 0x40000000;
            local_2c0 = vfmadd132ps_avx512vl(local_1a0,auVar140,auVar34);
            local_1a0 = local_2c0;
            auVar107 = local_1a0;
            local_280 = 0;
            local_270 = local_550._0_8_;
            uStack_268 = local_550._8_8_;
            local_260 = local_3c0._0_8_;
            uStack_258 = local_3c0._8_8_;
            local_250 = local_3d0._0_8_;
            uStack_248 = local_3d0._8_8_;
            local_240 = local_3b0._0_8_;
            uStack_238 = local_3b0._8_8_;
            if ((pGVar75->mask & ray->mask) != 0) {
              if ((local_618->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar77 = true, pGVar75->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar142 = 1.0 / auVar101._0_4_;
                local_220[0] = fVar142 * (local_480._0_4_ + 0.0);
                local_220[1] = fVar142 * (local_480._4_4_ + 1.0);
                local_220[2] = fVar142 * (local_480._8_4_ + 2.0);
                local_220[3] = fVar142 * (local_480._12_4_ + 3.0);
                fStack_210 = fVar142 * (local_480._16_4_ + 4.0);
                fStack_20c = fVar142 * (local_480._20_4_ + 5.0);
                fStack_208 = fVar142 * (local_480._24_4_ + 6.0);
                fStack_204 = local_480._28_4_ + 7.0;
                local_1a0._0_8_ = local_2c0._0_8_;
                local_1a0._8_8_ = local_2c0._8_8_;
                local_1a0._16_8_ = local_2c0._16_8_;
                local_1a0._24_8_ = local_2c0._24_8_;
                local_200 = local_1a0._0_8_;
                uStack_1f8 = local_1a0._8_8_;
                uStack_1f0 = local_1a0._16_8_;
                uStack_1e8 = local_1a0._24_8_;
                local_1e0 = local_4a0;
                local_570 = (Geometry *)local_3c0._0_8_;
                uStack_568 = local_3c0._8_8_;
                local_608 = 0;
                uVar74 = (ulong)local_230;
                for (uVar70 = uVar74; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000)
                {
                  local_608 = local_608 + 1;
                }
                local_530 = local_3d0._0_8_;
                uStack_528 = local_3d0._8_8_;
                local_540 = local_3b0._0_4_;
                fStack_53c = local_3b0._4_4_;
                fStack_538 = local_3b0._8_4_;
                fStack_534 = local_3b0._12_4_;
                bVar77 = true;
                local_610 = prim;
                local_560 = auVar89;
                local_4e0 = fVar158;
                local_4c0 = auVar97;
                local_2e0 = local_480;
                local_2a0 = local_4a0;
                local_27c = iVar8;
                local_1a0 = auVar107;
                do {
                  auVar82 = auVar202._0_16_;
                  local_5a4 = local_220[local_608];
                  local_5a0 = *(undefined4 *)((long)&local_200 + local_608 * 4);
                  local_600 = CONCAT44(local_600._4_4_,ray->tfar);
                  ray->tfar = *(float *)(local_1e0 + local_608 * 4);
                  local_5e0.context = context->user;
                  fVar157 = 1.0 - local_5a4;
                  fVar142 = fVar157 * fVar157 * -3.0;
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157)),
                                            ZEXT416((uint)(local_5a4 * fVar157)),ZEXT416(0xc0000000)
                                           );
                  auVar88 = vfmsub132ss_fma(ZEXT416((uint)(local_5a4 * fVar157)),
                                            ZEXT416((uint)(local_5a4 * local_5a4)),
                                            ZEXT416(0x40000000));
                  fVar157 = auVar89._0_4_ * 3.0;
                  fVar163 = auVar88._0_4_ * 3.0;
                  fVar170 = local_5a4 * local_5a4 * 3.0;
                  auVar175._0_4_ = fVar170 * local_540;
                  auVar175._4_4_ = fVar170 * fStack_53c;
                  auVar175._8_4_ = fVar170 * fStack_538;
                  auVar175._12_4_ = fVar170 * fStack_534;
                  auVar153._4_4_ = fVar163;
                  auVar153._0_4_ = fVar163;
                  auVar153._8_4_ = fVar163;
                  auVar153._12_4_ = fVar163;
                  auVar66._8_8_ = uStack_528;
                  auVar66._0_8_ = local_530;
                  auVar89 = vfmadd132ps_fma(auVar153,auVar175,auVar66);
                  auVar159._4_4_ = fVar157;
                  auVar159._0_4_ = fVar157;
                  auVar159._8_4_ = fVar157;
                  auVar159._12_4_ = fVar157;
                  auVar64._8_8_ = uStack_568;
                  auVar64._0_8_ = local_570;
                  auVar89 = vfmadd132ps_fma(auVar159,auVar89,auVar64);
                  auVar154._4_4_ = fVar142;
                  auVar154._0_4_ = fVar142;
                  auVar154._8_4_ = fVar142;
                  auVar154._12_4_ = fVar142;
                  auVar89 = vfmadd132ps_fma(auVar154,auVar89,local_550);
                  local_5b0 = vmovlps_avx(auVar89);
                  local_5a8 = vextractps_avx(auVar89,2);
                  local_59c = (undefined4)local_578;
                  local_598 = (undefined4)local_5f8;
                  local_594 = (local_5e0.context)->instID[0];
                  local_590 = (local_5e0.context)->instPrimID[0];
                  local_61c = -1;
                  local_5e0.valid = &local_61c;
                  local_5e0.geometryUserPtr = pGVar75->userPtr;
                  local_5e0.hit = (RTCHitN *)&local_5b0;
                  local_5e0.N = 1;
                  local_320 = (undefined4)uVar74;
                  uStack_31c = (undefined4)(uVar74 >> 0x20);
                  local_5e0.ray = (RTCRayN *)ray;
                  if (pGVar75->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c80205:
                    auVar97 = auVar198._0_32_;
                    auVar89 = auVar202._0_16_;
                    p_Var12 = context->args->filter;
                    fVar142 = auVar194._0_4_;
                    if (p_Var12 == (RTCFilterFunctionN)0x0) break;
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar75->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var12)(&local_5e0);
                      auVar194 = ZEXT1664(local_560);
                      auVar198 = ZEXT3264(local_4c0);
                      auVar206 = ZEXT3264(local_3a0);
                      auVar205 = ZEXT3264(local_380);
                      auVar204 = ZEXT3264(local_460);
                      auVar203 = ZEXT3264(local_440);
                      auVar207 = ZEXT3264(local_360);
                      auVar201 = ZEXT3264(local_420);
                      auVar200 = ZEXT3264(local_340);
                      auVar199 = ZEXT3264(local_400);
                      auVar89 = vxorps_avx512vl(auVar89,auVar89);
                      auVar202 = ZEXT1664(auVar89);
                      context = local_618;
                      prim = local_610;
                      fVar158 = local_4e0;
                    }
                    auVar97 = auVar198._0_32_;
                    uVar74 = CONCAT44(uStack_31c,local_320);
                    fVar142 = auVar194._0_4_;
                    if (*local_5e0.valid != 0) break;
                  }
                  else {
                    (*pGVar75->occlusionFilterN)(&local_5e0);
                    uVar74 = CONCAT44(uStack_31c,local_320);
                    auVar194 = ZEXT1664(local_560);
                    auVar198 = ZEXT3264(local_4c0);
                    auVar206 = ZEXT3264(local_3a0);
                    auVar205 = ZEXT3264(local_380);
                    auVar204 = ZEXT3264(local_460);
                    auVar203 = ZEXT3264(local_440);
                    auVar207 = ZEXT3264(local_360);
                    auVar201 = ZEXT3264(local_420);
                    auVar200 = ZEXT3264(local_340);
                    auVar199 = ZEXT3264(local_400);
                    auVar89 = vxorps_avx512vl(auVar82,auVar82);
                    auVar202 = ZEXT1664(auVar89);
                    context = local_618;
                    prim = local_610;
                    fVar158 = local_4e0;
                    if (*local_5e0.valid != 0) goto LAB_01c80205;
                  }
                  auVar97 = auVar198._0_32_;
                  ray->tfar = (float)local_600;
                  uVar70 = local_608 & 0x3f;
                  local_608 = 0;
                  uVar74 = uVar74 ^ 1L << uVar70;
                  for (uVar70 = uVar74; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000
                      ) {
                    local_608 = local_608 + 1;
                  }
                  bVar77 = uVar74 != 0;
                  fVar142 = auVar194._0_4_;
                } while (bVar77);
              }
              goto LAB_01c80354;
            }
          }
        }
        bVar77 = false;
      }
LAB_01c80354:
      local_4e0 = fVar142;
      local_610 = prim;
      if (8 < iVar8) {
        auVar107 = vpbroadcastd_avx512vl();
        auVar194 = ZEXT3264(auVar107);
        fStack_2f0 = 1.0 / (float)local_300._0_4_;
        local_300._4_4_ = fStack_2f0;
        local_300._0_4_ = fStack_2f0;
        fStack_2f8 = fStack_2f0;
        fStack_2f4 = fStack_2f0;
        lVar73 = 8;
        fStack_4dc = local_4e0;
        fStack_4d8 = local_4e0;
        fStack_4d4 = local_4e0;
        fStack_4d0 = local_4e0;
        fStack_4cc = local_4e0;
        fStack_4c8 = local_4e0;
        fStack_4c4 = local_4e0;
        local_4c0 = auVar97;
        local_320 = fVar158;
        uStack_31c = fVar158;
        uStack_318 = fVar158;
        uStack_314 = fVar158;
        uStack_310 = fVar158;
        uStack_30c = fVar158;
        uStack_308 = fVar158;
        uStack_304 = fVar158;
        fStack_2ec = fStack_2f0;
        fStack_2e8 = fStack_2f0;
        fStack_2e4 = fStack_2f0;
        do {
          auVar107 = vpbroadcastd_avx512vl();
          auVar92 = vpor_avx2(auVar107,_DAT_0205a920);
          uVar25 = vpcmpgtd_avx512vl(auVar194._0_32_,auVar92);
          auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 * 4 + lVar26);
          auVar109 = *(undefined1 (*) [32])(lVar26 + 0x2227768 + lVar73 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar26 + 0x2227bec + lVar73 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar26 + 0x2228070 + lVar73 * 4);
          local_380 = auVar205._0_32_;
          auVar93 = vmulps_avx512vl(local_380,auVar104);
          local_3a0 = auVar206._0_32_;
          auVar103 = vmulps_avx512vl(local_3a0,auVar104);
          auVar45._4_4_ = auVar104._4_4_ * (float)local_e0._4_4_;
          auVar45._0_4_ = auVar104._0_4_ * (float)local_e0._0_4_;
          auVar45._8_4_ = auVar104._8_4_ * fStack_d8;
          auVar45._12_4_ = auVar104._12_4_ * fStack_d4;
          auVar45._16_4_ = auVar104._16_4_ * fStack_d0;
          auVar45._20_4_ = auVar104._20_4_ * fStack_cc;
          auVar45._24_4_ = auVar104._24_4_ * fStack_c8;
          auVar45._28_4_ = auVar92._28_4_;
          auVar111 = auVar203._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar93,auVar105,auVar111);
          auVar112 = auVar204._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar112);
          auVar103 = vfmadd231ps_avx512vl(auVar45,auVar105,local_c0);
          auVar110 = auVar201._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar109,auVar110);
          local_360 = auVar207._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar109,local_360);
          auVar89 = vfmadd231ps_fma(auVar103,auVar109,local_a0);
          auVar108 = auVar199._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar92,auVar107,auVar108);
          local_340 = auVar200._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar93,auVar107,local_340);
          auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 * 4 + lVar26);
          auVar93 = *(undefined1 (*) [32])(lVar26 + 0x2229b88 + lVar73 * 4);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar107,local_80);
          auVar103 = *(undefined1 (*) [32])(lVar26 + 0x222a00c + lVar73 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar26 + 0x222a490 + lVar73 * 4);
          auVar97 = vmulps_avx512vl(local_380,auVar94);
          auVar95 = vmulps_avx512vl(local_3a0,auVar94);
          auVar46._4_4_ = auVar94._4_4_ * (float)local_e0._4_4_;
          auVar46._0_4_ = auVar94._0_4_ * (float)local_e0._0_4_;
          auVar46._8_4_ = auVar94._8_4_ * fStack_d8;
          auVar46._12_4_ = auVar94._12_4_ * fStack_d4;
          auVar46._16_4_ = auVar94._16_4_ * fStack_d0;
          auVar46._20_4_ = auVar94._20_4_ * fStack_cc;
          auVar46._24_4_ = auVar94._24_4_ * fStack_c8;
          auVar46._28_4_ = uStack_c4;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar111);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,auVar112);
          auVar99 = vfmadd231ps_avx512vl(auVar46,auVar103,local_c0);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar110);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_360);
          auVar88 = vfmadd231ps_fma(auVar99,auVar93,local_a0);
          auVar99 = vfmadd231ps_avx512vl(auVar97,auVar92,auVar108);
          auVar100 = vfmadd231ps_avx512vl(auVar95,auVar92,local_340);
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar92,local_80);
          auVar101 = vmaxps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar88));
          auVar97 = vsubps_avx(auVar99,auVar96);
          auVar95 = vsubps_avx(auVar100,auVar98);
          auVar102 = vmulps_avx512vl(auVar98,auVar97);
          auVar106 = vmulps_avx512vl(auVar96,auVar95);
          auVar102 = vsubps_avx512vl(auVar102,auVar106);
          auVar106 = vmulps_avx512vl(auVar95,auVar95);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,auVar97);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          auVar101 = vmulps_avx512vl(auVar101,auVar106);
          auVar102 = vmulps_avx512vl(auVar102,auVar102);
          uVar135 = vcmpps_avx512vl(auVar102,auVar101,2);
          local_230 = (byte)uVar25 & (byte)uVar135;
          if (local_230 != 0) {
            auVar94 = vmulps_avx512vl(local_4c0,auVar94);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_140,auVar94);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar103);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_100,auVar93);
            auVar104 = vmulps_avx512vl(local_4c0,auVar104);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar104);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_120,auVar105);
            auVar93 = vfmadd213ps_avx512vl(auVar107,local_100,auVar109);
            auVar107 = *(undefined1 (*) [32])(lVar26 + 0x22284f4 + lVar73 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar26 + 0x2228978 + lVar73 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar26 + 0x2228dfc + lVar73 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar26 + 0x2229280 + lVar73 * 4);
            auVar103 = vmulps_avx512vl(local_380,auVar104);
            auVar94 = vmulps_avx512vl(local_3a0,auVar104);
            auVar104 = vmulps_avx512vl(local_4c0,auVar104);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar111);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar105,auVar112);
            auVar105 = vfmadd231ps_avx512vl(auVar104,local_140,auVar105);
            auVar104 = vfmadd231ps_avx512vl(auVar103,auVar109,auVar110);
            auVar103 = vfmadd231ps_avx512vl(auVar94,auVar109,local_360);
            auVar109 = vfmadd231ps_avx512vl(auVar105,local_120,auVar109);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar108);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_340);
            auVar94 = vfmadd231ps_avx512vl(auVar109,local_100,auVar107);
            auVar107 = *(undefined1 (*) [32])(lVar26 + 0x222a914 + lVar73 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar26 + 0x222b21c + lVar73 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar26 + 0x222b6a0 + lVar73 * 4);
            auVar101 = vmulps_avx512vl(local_380,auVar105);
            auVar102 = vmulps_avx512vl(local_3a0,auVar105);
            auVar105 = vmulps_avx512vl(local_4c0,auVar105);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,auVar111);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,auVar112);
            auVar105 = vfmadd231ps_avx512vl(auVar105,local_140,auVar109);
            auVar109 = *(undefined1 (*) [32])(lVar26 + 0x222ad98 + lVar73 * 4);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,auVar110);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_360);
            auVar109 = vfmadd231ps_avx512vl(auVar105,local_120,auVar109);
            auVar105 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar108);
            auVar101 = vfmadd231ps_avx512vl(auVar102,auVar107,local_340);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_100,auVar107);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar104,auVar102);
            vandps_avx512vl(auVar103,auVar102);
            auVar107 = vmaxps_avx(auVar102,auVar102);
            vandps_avx512vl(auVar94,auVar102);
            auVar107 = vmaxps_avx(auVar107,auVar102);
            auVar68._4_4_ = fStack_4dc;
            auVar68._0_4_ = local_4e0;
            auVar68._8_4_ = fStack_4d8;
            auVar68._12_4_ = fStack_4d4;
            auVar68._16_4_ = fStack_4d0;
            auVar68._20_4_ = fStack_4cc;
            auVar68._24_4_ = fStack_4c8;
            auVar68._28_4_ = fStack_4c4;
            uVar70 = vcmpps_avx512vl(auVar107,auVar68,1);
            bVar14 = (bool)((byte)uVar70 & 1);
            auVar118._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar104._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar104._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar104._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar104._12_4_);
            bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar104._16_4_);
            bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar104._20_4_);
            bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar104._24_4_);
            bVar14 = SUB81(uVar70 >> 7,0);
            auVar118._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar104._28_4_;
            bVar14 = (bool)((byte)uVar70 & 1);
            auVar119._0_4_ = (float)((uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar103._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar103._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar103._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar103._12_4_);
            bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar119._16_4_ =
                 (float)((uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar103._16_4_);
            bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar119._20_4_ =
                 (float)((uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar103._20_4_);
            bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar119._24_4_ =
                 (float)((uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar103._24_4_);
            bVar14 = SUB81(uVar70 >> 7,0);
            auVar119._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar103._28_4_;
            vandps_avx512vl(auVar105,auVar102);
            vandps_avx512vl(auVar101,auVar102);
            auVar107 = vmaxps_avx(auVar119,auVar119);
            vandps_avx512vl(auVar109,auVar102);
            auVar107 = vmaxps_avx(auVar107,auVar119);
            uVar70 = vcmpps_avx512vl(auVar107,auVar68,1);
            bVar14 = (bool)((byte)uVar70 & 1);
            auVar120._0_4_ = (uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar105._0_4_;
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar120._4_4_ = (uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar105._4_4_;
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar120._8_4_ = (uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar105._8_4_;
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar120._12_4_ = (uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar105._12_4_;
            bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar120._16_4_ = (uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar105._16_4_;
            bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar120._20_4_ = (uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar105._20_4_;
            bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar120._24_4_ = (uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar105._24_4_;
            bVar14 = SUB81(uVar70 >> 7,0);
            auVar120._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar105._28_4_;
            bVar14 = (bool)((byte)uVar70 & 1);
            auVar121._0_4_ = (float)((uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar101._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar101._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar101._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar101._12_4_);
            bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar121._16_4_ =
                 (float)((uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar101._16_4_);
            bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar121._20_4_ =
                 (float)((uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar101._20_4_);
            bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar121._24_4_ =
                 (float)((uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar101._24_4_);
            bVar14 = SUB81(uVar70 >> 7,0);
            auVar121._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar101._28_4_;
            auVar187._8_4_ = 0x80000000;
            auVar187._0_8_ = 0x8000000080000000;
            auVar187._12_4_ = 0x80000000;
            auVar187._16_4_ = 0x80000000;
            auVar187._20_4_ = 0x80000000;
            auVar187._24_4_ = 0x80000000;
            auVar187._28_4_ = 0x80000000;
            auVar107 = vxorps_avx512vl(auVar120,auVar187);
            auVar101 = auVar202._0_32_;
            auVar109 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar101);
            auVar82 = vfmadd231ps_fma(auVar109,auVar119,auVar119);
            auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
            auVar197._8_4_ = 0xbf000000;
            auVar197._0_8_ = 0xbf000000bf000000;
            auVar197._12_4_ = 0xbf000000;
            auVar197._16_4_ = 0xbf000000;
            auVar197._20_4_ = 0xbf000000;
            auVar197._24_4_ = 0xbf000000;
            auVar197._28_4_ = 0xbf000000;
            fVar158 = auVar109._0_4_;
            fVar142 = auVar109._4_4_;
            fVar157 = auVar109._8_4_;
            fVar163 = auVar109._12_4_;
            fVar170 = auVar109._16_4_;
            fVar171 = auVar109._20_4_;
            fVar172 = auVar109._24_4_;
            auVar47._4_4_ = fVar142 * fVar142 * fVar142 * auVar82._4_4_ * -0.5;
            auVar47._0_4_ = fVar158 * fVar158 * fVar158 * auVar82._0_4_ * -0.5;
            auVar47._8_4_ = fVar157 * fVar157 * fVar157 * auVar82._8_4_ * -0.5;
            auVar47._12_4_ = fVar163 * fVar163 * fVar163 * auVar82._12_4_ * -0.5;
            auVar47._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar47._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar47._24_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar47._28_4_ = auVar119._28_4_;
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar109 = vfmadd231ps_avx512vl(auVar47,auVar105,auVar109);
            auVar48._4_4_ = auVar119._4_4_ * auVar109._4_4_;
            auVar48._0_4_ = auVar119._0_4_ * auVar109._0_4_;
            auVar48._8_4_ = auVar119._8_4_ * auVar109._8_4_;
            auVar48._12_4_ = auVar119._12_4_ * auVar109._12_4_;
            auVar48._16_4_ = auVar119._16_4_ * auVar109._16_4_;
            auVar48._20_4_ = auVar119._20_4_ * auVar109._20_4_;
            auVar48._24_4_ = auVar119._24_4_ * auVar109._24_4_;
            auVar48._28_4_ = 0;
            auVar49._4_4_ = auVar109._4_4_ * -auVar118._4_4_;
            auVar49._0_4_ = auVar109._0_4_ * -auVar118._0_4_;
            auVar49._8_4_ = auVar109._8_4_ * -auVar118._8_4_;
            auVar49._12_4_ = auVar109._12_4_ * -auVar118._12_4_;
            auVar49._16_4_ = auVar109._16_4_ * -auVar118._16_4_;
            auVar49._20_4_ = auVar109._20_4_ * -auVar118._20_4_;
            auVar49._24_4_ = auVar109._24_4_ * -auVar118._24_4_;
            auVar49._28_4_ = auVar119._28_4_;
            auVar104 = vmulps_avx512vl(auVar109,auVar101);
            auVar109 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar101);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar121,auVar121);
            auVar103 = vrsqrt14ps_avx512vl(auVar109);
            auVar109 = vmulps_avx512vl(auVar109,auVar197);
            fVar158 = auVar103._0_4_;
            fVar142 = auVar103._4_4_;
            fVar157 = auVar103._8_4_;
            fVar163 = auVar103._12_4_;
            fVar170 = auVar103._16_4_;
            fVar171 = auVar103._20_4_;
            fVar172 = auVar103._24_4_;
            auVar50._4_4_ = fVar142 * fVar142 * fVar142 * auVar109._4_4_;
            auVar50._0_4_ = fVar158 * fVar158 * fVar158 * auVar109._0_4_;
            auVar50._8_4_ = fVar157 * fVar157 * fVar157 * auVar109._8_4_;
            auVar50._12_4_ = fVar163 * fVar163 * fVar163 * auVar109._12_4_;
            auVar50._16_4_ = fVar170 * fVar170 * fVar170 * auVar109._16_4_;
            auVar50._20_4_ = fVar171 * fVar171 * fVar171 * auVar109._20_4_;
            auVar50._24_4_ = fVar172 * fVar172 * fVar172 * auVar109._24_4_;
            auVar50._28_4_ = auVar109._28_4_;
            auVar109 = vfmadd231ps_avx512vl(auVar50,auVar105,auVar103);
            auVar51._4_4_ = auVar121._4_4_ * auVar109._4_4_;
            auVar51._0_4_ = auVar121._0_4_ * auVar109._0_4_;
            auVar51._8_4_ = auVar121._8_4_ * auVar109._8_4_;
            auVar51._12_4_ = auVar121._12_4_ * auVar109._12_4_;
            auVar51._16_4_ = auVar121._16_4_ * auVar109._16_4_;
            auVar51._20_4_ = auVar121._20_4_ * auVar109._20_4_;
            auVar51._24_4_ = auVar121._24_4_ * auVar109._24_4_;
            auVar51._28_4_ = auVar103._28_4_;
            auVar52._4_4_ = auVar109._4_4_ * auVar107._4_4_;
            auVar52._0_4_ = auVar109._0_4_ * auVar107._0_4_;
            auVar52._8_4_ = auVar109._8_4_ * auVar107._8_4_;
            auVar52._12_4_ = auVar109._12_4_ * auVar107._12_4_;
            auVar52._16_4_ = auVar109._16_4_ * auVar107._16_4_;
            auVar52._20_4_ = auVar109._20_4_ * auVar107._20_4_;
            auVar52._24_4_ = auVar109._24_4_ * auVar107._24_4_;
            auVar52._28_4_ = auVar107._28_4_;
            auVar107 = vmulps_avx512vl(auVar109,auVar101);
            auVar82 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar89),auVar96);
            auVar109 = ZEXT1632(auVar89);
            auVar21 = vfmadd213ps_fma(auVar49,auVar109,auVar98);
            auVar105 = vfmadd213ps_avx512vl(auVar104,auVar109,auVar93);
            auVar103 = vfmadd213ps_avx512vl(auVar51,ZEXT1632(auVar88),auVar99);
            auVar84 = vfnmadd213ps_fma(auVar48,auVar109,auVar96);
            auVar94 = ZEXT1632(auVar88);
            auVar22 = vfmadd213ps_fma(auVar52,auVar94,auVar100);
            auVar90 = vfnmadd213ps_fma(auVar49,auVar109,auVar98);
            auVar83 = vfmadd213ps_fma(auVar107,auVar94,auVar92);
            auVar98 = ZEXT1632(auVar89);
            auVar29 = vfnmadd231ps_fma(auVar93,auVar98,auVar104);
            auVar91 = vfnmadd213ps_fma(auVar51,auVar94,auVar99);
            auVar28 = vfnmadd213ps_fma(auVar52,auVar94,auVar100);
            auVar81 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar88),auVar107);
            auVar92 = vsubps_avx512vl(auVar103,ZEXT1632(auVar84));
            auVar107 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar90));
            auVar109 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar29));
            auVar53._4_4_ = auVar107._4_4_ * auVar29._4_4_;
            auVar53._0_4_ = auVar107._0_4_ * auVar29._0_4_;
            auVar53._8_4_ = auVar107._8_4_ * auVar29._8_4_;
            auVar53._12_4_ = auVar107._12_4_ * auVar29._12_4_;
            auVar53._16_4_ = auVar107._16_4_ * 0.0;
            auVar53._20_4_ = auVar107._20_4_ * 0.0;
            auVar53._24_4_ = auVar107._24_4_ * 0.0;
            auVar53._28_4_ = auVar104._28_4_;
            auVar89 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar90),auVar109);
            auVar54._4_4_ = auVar109._4_4_ * auVar84._4_4_;
            auVar54._0_4_ = auVar109._0_4_ * auVar84._0_4_;
            auVar54._8_4_ = auVar109._8_4_ * auVar84._8_4_;
            auVar54._12_4_ = auVar109._12_4_ * auVar84._12_4_;
            auVar54._16_4_ = auVar109._16_4_ * 0.0;
            auVar54._20_4_ = auVar109._20_4_ * 0.0;
            auVar54._24_4_ = auVar109._24_4_ * 0.0;
            auVar54._28_4_ = auVar109._28_4_;
            auVar23 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar29),auVar92);
            auVar55._4_4_ = auVar90._4_4_ * auVar92._4_4_;
            auVar55._0_4_ = auVar90._0_4_ * auVar92._0_4_;
            auVar55._8_4_ = auVar90._8_4_ * auVar92._8_4_;
            auVar55._12_4_ = auVar90._12_4_ * auVar92._12_4_;
            auVar55._16_4_ = auVar92._16_4_ * 0.0;
            auVar55._20_4_ = auVar92._20_4_ * 0.0;
            auVar55._24_4_ = auVar92._24_4_ * 0.0;
            auVar55._28_4_ = auVar92._28_4_;
            auVar24 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar84),auVar107);
            auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar101,ZEXT1632(auVar23));
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar101,ZEXT1632(auVar89));
            uVar70 = vcmpps_avx512vl(auVar107,auVar101,2);
            bVar13 = (byte)uVar70;
            fVar80 = (float)((uint)(bVar13 & 1) * auVar82._0_4_ |
                            (uint)!(bool)(bVar13 & 1) * auVar91._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            fVar128 = (float)((uint)bVar14 * auVar82._4_4_ | (uint)!bVar14 * auVar91._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            fVar130 = (float)((uint)bVar14 * auVar82._8_4_ | (uint)!bVar14 * auVar91._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            fVar132 = (float)((uint)bVar14 * auVar82._12_4_ | (uint)!bVar14 * auVar91._12_4_);
            auVar94 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar80))));
            fVar127 = (float)((uint)(bVar13 & 1) * auVar21._0_4_ |
                             (uint)!(bool)(bVar13 & 1) * auVar28._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            fVar129 = (float)((uint)bVar14 * auVar21._4_4_ | (uint)!bVar14 * auVar28._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            fVar131 = (float)((uint)bVar14 * auVar21._8_4_ | (uint)!bVar14 * auVar28._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            fVar133 = (float)((uint)bVar14 * auVar21._12_4_ | (uint)!bVar14 * auVar28._12_4_);
            auVar97 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar127))));
            auVar122._0_4_ =
                 (float)((uint)(bVar13 & 1) * auVar105._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar81._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar81._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar81._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar81._12_4_);
            fVar158 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar105._16_4_);
            auVar122._16_4_ = fVar158;
            fVar142 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar105._20_4_);
            auVar122._20_4_ = fVar142;
            fVar157 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar105._24_4_);
            auVar122._24_4_ = fVar157;
            iVar1 = (uint)(byte)(uVar70 >> 7) * auVar105._28_4_;
            auVar122._28_4_ = iVar1;
            auVar107 = vblendmps_avx512vl(ZEXT1632(auVar84),auVar103);
            auVar123._0_4_ =
                 (uint)(bVar13 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar89._0_4_;
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar89._4_4_;
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar89._8_4_;
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar89._12_4_;
            auVar123._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_;
            auVar123._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_;
            auVar123._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_;
            auVar123._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
            auVar107 = vblendmps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar22));
            auVar124._0_4_ =
                 (float)((uint)(bVar13 & 1) * auVar107._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar82._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar82._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar82._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar82._12_4_);
            fVar170 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_);
            auVar124._16_4_ = fVar170;
            fVar171 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_);
            auVar124._20_4_ = fVar171;
            fVar163 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_);
            auVar124._24_4_ = fVar163;
            auVar124._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
            auVar107 = vblendmps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar83));
            auVar125._0_4_ =
                 (float)((uint)(bVar13 & 1) * auVar107._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar21._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar21._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar21._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar21._12_4_);
            fVar79 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_);
            auVar125._16_4_ = fVar79;
            fVar162 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_);
            auVar125._20_4_ = fVar162;
            fVar172 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_);
            auVar125._24_4_ = fVar172;
            iVar2 = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
            auVar125._28_4_ = iVar2;
            auVar126._0_4_ =
                 (uint)(bVar13 & 1) * (int)auVar84._0_4_ |
                 (uint)!(bool)(bVar13 & 1) * auVar103._0_4_;
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar14 * (int)auVar84._4_4_ | (uint)!bVar14 * auVar103._4_4_;
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar14 * (int)auVar84._8_4_ | (uint)!bVar14 * auVar103._8_4_;
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar14 * (int)auVar84._12_4_ | (uint)!bVar14 * auVar103._12_4_;
            auVar126._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar103._16_4_;
            auVar126._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar103._20_4_;
            auVar126._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar103._24_4_;
            auVar126._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar103._28_4_;
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar70 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar103 = vsubps_avx512vl(auVar126,auVar94);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar90._12_4_ |
                                                     (uint)!bVar18 * auVar22._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar90._8_4_ |
                                                              (uint)!bVar16 * auVar22._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar90._4_4_ |
                                                                       (uint)!bVar14 * auVar22._4_4_
                                                                       ,(uint)(bVar13 & 1) *
                                                                        (int)auVar90._0_4_ |
                                                                        (uint)!(bool)(bVar13 & 1) *
                                                                        auVar22._0_4_)))),auVar97);
            auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar29._12_4_ |
                                                     (uint)!bVar19 * auVar83._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar29._8_4_ |
                                                              (uint)!bVar17 * auVar83._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar29._4_4_ |
                                                                       (uint)!bVar15 * auVar83._4_4_
                                                                       ,(uint)(bVar13 & 1) *
                                                                        (int)auVar29._0_4_ |
                                                                        (uint)!(bool)(bVar13 & 1) *
                                                                        auVar83._0_4_)))),auVar122);
            auVar104 = vsubps_avx(auVar94,auVar123);
            auVar92 = vsubps_avx(auVar97,auVar124);
            auVar93 = vsubps_avx(auVar122,auVar125);
            auVar56._4_4_ = auVar105._4_4_ * fVar128;
            auVar56._0_4_ = auVar105._0_4_ * fVar80;
            auVar56._8_4_ = auVar105._8_4_ * fVar130;
            auVar56._12_4_ = auVar105._12_4_ * fVar132;
            auVar56._16_4_ = auVar105._16_4_ * 0.0;
            auVar56._20_4_ = auVar105._20_4_ * 0.0;
            auVar56._24_4_ = auVar105._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar89 = vfmsub231ps_fma(auVar56,auVar122,auVar103);
            auVar161._0_4_ = fVar127 * auVar103._0_4_;
            auVar161._4_4_ = fVar129 * auVar103._4_4_;
            auVar161._8_4_ = fVar131 * auVar103._8_4_;
            auVar161._12_4_ = fVar133 * auVar103._12_4_;
            auVar161._16_4_ = auVar103._16_4_ * 0.0;
            auVar161._20_4_ = auVar103._20_4_ * 0.0;
            auVar161._24_4_ = auVar103._24_4_ * 0.0;
            auVar161._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar161,auVar94,auVar109);
            auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar101,ZEXT1632(auVar89));
            auVar168._0_4_ = auVar109._0_4_ * auVar122._0_4_;
            auVar168._4_4_ = auVar109._4_4_ * auVar122._4_4_;
            auVar168._8_4_ = auVar109._8_4_ * auVar122._8_4_;
            auVar168._12_4_ = auVar109._12_4_ * auVar122._12_4_;
            auVar168._16_4_ = auVar109._16_4_ * fVar158;
            auVar168._20_4_ = auVar109._20_4_ * fVar142;
            auVar168._24_4_ = auVar109._24_4_ * fVar157;
            auVar168._28_4_ = 0;
            auVar89 = vfmsub231ps_fma(auVar168,auVar97,auVar105);
            auVar95 = vfmadd231ps_avx512vl(auVar107,auVar101,ZEXT1632(auVar89));
            auVar107 = vmulps_avx512vl(auVar93,auVar123);
            auVar107 = vfmsub231ps_avx512vl(auVar107,auVar104,auVar125);
            auVar57._4_4_ = auVar92._4_4_ * auVar125._4_4_;
            auVar57._0_4_ = auVar92._0_4_ * auVar125._0_4_;
            auVar57._8_4_ = auVar92._8_4_ * auVar125._8_4_;
            auVar57._12_4_ = auVar92._12_4_ * auVar125._12_4_;
            auVar57._16_4_ = auVar92._16_4_ * fVar79;
            auVar57._20_4_ = auVar92._20_4_ * fVar162;
            auVar57._24_4_ = auVar92._24_4_ * fVar172;
            auVar57._28_4_ = iVar2;
            auVar89 = vfmsub231ps_fma(auVar57,auVar124,auVar93);
            auVar169._0_4_ = auVar124._0_4_ * auVar104._0_4_;
            auVar169._4_4_ = auVar124._4_4_ * auVar104._4_4_;
            auVar169._8_4_ = auVar124._8_4_ * auVar104._8_4_;
            auVar169._12_4_ = auVar124._12_4_ * auVar104._12_4_;
            auVar169._16_4_ = fVar170 * auVar104._16_4_;
            auVar169._20_4_ = fVar171 * auVar104._20_4_;
            auVar169._24_4_ = fVar163 * auVar104._24_4_;
            auVar169._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar169,auVar92,auVar123);
            auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar101,auVar107);
            auVar96 = vfmadd231ps_avx512vl(auVar107,auVar101,ZEXT1632(auVar89));
            auVar107 = vmaxps_avx(auVar95,auVar96);
            uVar135 = vcmpps_avx512vl(auVar107,auVar101,2);
            local_230 = local_230 & (byte)uVar135;
            if (local_230 == 0) {
LAB_01c80dbb:
              local_230 = 0;
            }
            else {
              auVar58._4_4_ = auVar93._4_4_ * auVar109._4_4_;
              auVar58._0_4_ = auVar93._0_4_ * auVar109._0_4_;
              auVar58._8_4_ = auVar93._8_4_ * auVar109._8_4_;
              auVar58._12_4_ = auVar93._12_4_ * auVar109._12_4_;
              auVar58._16_4_ = auVar93._16_4_ * auVar109._16_4_;
              auVar58._20_4_ = auVar93._20_4_ * auVar109._20_4_;
              auVar58._24_4_ = auVar93._24_4_ * auVar109._24_4_;
              auVar58._28_4_ = auVar107._28_4_;
              auVar21 = vfmsub231ps_fma(auVar58,auVar92,auVar105);
              auVar59._4_4_ = auVar105._4_4_ * auVar104._4_4_;
              auVar59._0_4_ = auVar105._0_4_ * auVar104._0_4_;
              auVar59._8_4_ = auVar105._8_4_ * auVar104._8_4_;
              auVar59._12_4_ = auVar105._12_4_ * auVar104._12_4_;
              auVar59._16_4_ = auVar105._16_4_ * auVar104._16_4_;
              auVar59._20_4_ = auVar105._20_4_ * auVar104._20_4_;
              auVar59._24_4_ = auVar105._24_4_ * auVar104._24_4_;
              auVar59._28_4_ = auVar105._28_4_;
              auVar82 = vfmsub231ps_fma(auVar59,auVar103,auVar93);
              auVar60._4_4_ = auVar92._4_4_ * auVar103._4_4_;
              auVar60._0_4_ = auVar92._0_4_ * auVar103._0_4_;
              auVar60._8_4_ = auVar92._8_4_ * auVar103._8_4_;
              auVar60._12_4_ = auVar92._12_4_ * auVar103._12_4_;
              auVar60._16_4_ = auVar92._16_4_ * auVar103._16_4_;
              auVar60._20_4_ = auVar92._20_4_ * auVar103._20_4_;
              auVar60._24_4_ = auVar92._24_4_ * auVar103._24_4_;
              auVar60._28_4_ = auVar92._28_4_;
              auVar22 = vfmsub231ps_fma(auVar60,auVar104,auVar109);
              auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar22));
              auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar21),auVar101);
              auVar109 = vrcp14ps_avx512vl(auVar107);
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = &DAT_3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar35._16_4_ = 0x3f800000;
              auVar35._20_4_ = 0x3f800000;
              auVar35._24_4_ = 0x3f800000;
              auVar35._28_4_ = 0x3f800000;
              auVar105 = vfnmadd213ps_avx512vl(auVar109,auVar107,auVar35);
              auVar89 = vfmadd132ps_fma(auVar105,auVar109,auVar109);
              auVar61._4_4_ = auVar22._4_4_ * auVar122._4_4_;
              auVar61._0_4_ = auVar22._0_4_ * auVar122._0_4_;
              auVar61._8_4_ = auVar22._8_4_ * auVar122._8_4_;
              auVar61._12_4_ = auVar22._12_4_ * auVar122._12_4_;
              auVar61._16_4_ = fVar158 * 0.0;
              auVar61._20_4_ = fVar142 * 0.0;
              auVar61._24_4_ = fVar157 * 0.0;
              auVar61._28_4_ = iVar1;
              auVar82 = vfmadd231ps_fma(auVar61,auVar97,ZEXT1632(auVar82));
              auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar94,ZEXT1632(auVar21));
              fVar142 = auVar89._0_4_;
              fVar157 = auVar89._4_4_;
              fVar163 = auVar89._8_4_;
              fVar170 = auVar89._12_4_;
              auVar109 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar170,
                                            CONCAT48(auVar82._8_4_ * fVar163,
                                                     CONCAT44(auVar82._4_4_ * fVar157,
                                                              auVar82._0_4_ * fVar142))));
              auVar69._4_4_ = uStack_31c;
              auVar69._0_4_ = local_320;
              auVar69._8_4_ = uStack_318;
              auVar69._12_4_ = uStack_314;
              auVar69._16_4_ = uStack_310;
              auVar69._20_4_ = uStack_30c;
              auVar69._24_4_ = uStack_308;
              auVar69._28_4_ = uStack_304;
              uVar135 = vcmpps_avx512vl(auVar109,auVar69,0xd);
              fVar158 = ray->tfar;
              auVar36._4_4_ = fVar158;
              auVar36._0_4_ = fVar158;
              auVar36._8_4_ = fVar158;
              auVar36._12_4_ = fVar158;
              auVar36._16_4_ = fVar158;
              auVar36._20_4_ = fVar158;
              auVar36._24_4_ = fVar158;
              auVar36._28_4_ = fVar158;
              uVar25 = vcmpps_avx512vl(auVar109,auVar36,2);
              local_230 = (byte)uVar135 & (byte)uVar25 & local_230;
              if (local_230 == 0) goto LAB_01c80dbb;
              uVar135 = vcmpps_avx512vl(auVar107,auVar101,4);
              if ((local_230 & (byte)uVar135) == 0) goto LAB_01c80dbb;
              local_230 = local_230 & (byte)uVar135;
              fVar158 = auVar95._0_4_ * fVar142;
              fVar171 = auVar95._4_4_ * fVar157;
              auVar62._4_4_ = fVar171;
              auVar62._0_4_ = fVar158;
              fVar172 = auVar95._8_4_ * fVar163;
              auVar62._8_4_ = fVar172;
              fVar162 = auVar95._12_4_ * fVar170;
              auVar62._12_4_ = fVar162;
              fVar79 = auVar95._16_4_ * 0.0;
              auVar62._16_4_ = fVar79;
              fVar80 = auVar95._20_4_ * 0.0;
              auVar62._20_4_ = fVar80;
              fVar127 = auVar95._24_4_ * 0.0;
              auVar62._24_4_ = fVar127;
              auVar62._28_4_ = auVar95._28_4_;
              fVar142 = auVar96._0_4_ * fVar142;
              fVar157 = auVar96._4_4_ * fVar157;
              auVar63._4_4_ = fVar157;
              auVar63._0_4_ = fVar142;
              fVar163 = auVar96._8_4_ * fVar163;
              auVar63._8_4_ = fVar163;
              fVar170 = auVar96._12_4_ * fVar170;
              auVar63._12_4_ = fVar170;
              fVar128 = auVar96._16_4_ * 0.0;
              auVar63._16_4_ = fVar128;
              fVar129 = auVar96._20_4_ * 0.0;
              auVar63._20_4_ = fVar129;
              fVar130 = auVar96._24_4_ * 0.0;
              auVar63._24_4_ = fVar130;
              auVar63._28_4_ = auVar96._28_4_;
              auVar178._8_4_ = 0x3f800000;
              auVar178._0_8_ = &DAT_3f8000003f800000;
              auVar178._12_4_ = 0x3f800000;
              auVar178._16_4_ = 0x3f800000;
              auVar178._20_4_ = 0x3f800000;
              auVar178._24_4_ = 0x3f800000;
              auVar178._28_4_ = 0x3f800000;
              auVar107 = vsubps_avx(auVar178,auVar62);
              local_500._0_4_ =
                   (uint)(bVar13 & 1) * (int)fVar158 | (uint)!(bool)(bVar13 & 1) * auVar107._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              local_500._4_4_ = (uint)bVar14 * (int)fVar171 | (uint)!bVar14 * auVar107._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              local_500._8_4_ = (uint)bVar14 * (int)fVar172 | (uint)!bVar14 * auVar107._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              local_500._12_4_ = (uint)bVar14 * (int)fVar162 | (uint)!bVar14 * auVar107._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              local_500._16_4_ = (uint)bVar14 * (int)fVar79 | (uint)!bVar14 * auVar107._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              local_500._20_4_ = (uint)bVar14 * (int)fVar80 | (uint)!bVar14 * auVar107._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              local_500._24_4_ = (uint)bVar14 * (int)fVar127 | (uint)!bVar14 * auVar107._24_4_;
              bVar14 = SUB81(uVar70 >> 7,0);
              local_500._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar107._28_4_;
              auVar107 = vsubps_avx(auVar178,auVar63);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = SUB81(uVar70 >> 7,0);
              local_1c0._4_4_ = (uint)bVar14 * (int)fVar157 | (uint)!bVar14 * auVar107._4_4_;
              local_1c0._0_4_ =
                   (uint)(bVar13 & 1) * (int)fVar142 | (uint)!(bool)(bVar13 & 1) * auVar107._0_4_;
              local_1c0._8_4_ = (uint)bVar15 * (int)fVar163 | (uint)!bVar15 * auVar107._8_4_;
              local_1c0._12_4_ = (uint)bVar16 * (int)fVar170 | (uint)!bVar16 * auVar107._12_4_;
              local_1c0._16_4_ = (uint)bVar17 * (int)fVar128 | (uint)!bVar17 * auVar107._16_4_;
              local_1c0._20_4_ = (uint)bVar18 * (int)fVar129 | (uint)!bVar18 * auVar107._20_4_;
              local_1c0._24_4_ = (uint)bVar19 * (int)fVar130 | (uint)!bVar19 * auVar107._24_4_;
              local_1c0._28_4_ = (uint)bVar20 * auVar96._28_4_ | (uint)!bVar20 * auVar107._28_4_;
              local_520 = auVar109;
            }
            if (local_230 != 0) {
              auVar107 = vsubps_avx(ZEXT1632(auVar88),auVar98);
              auVar89 = vfmadd213ps_fma(auVar107,local_500,auVar98);
              fVar158 = local_5f0->depth_scale;
              auVar37._4_4_ = fVar158;
              auVar37._0_4_ = fVar158;
              auVar37._8_4_ = fVar158;
              auVar37._12_4_ = fVar158;
              auVar37._16_4_ = fVar158;
              auVar37._20_4_ = fVar158;
              auVar37._24_4_ = fVar158;
              auVar37._28_4_ = fVar158;
              auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                            CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                     CONCAT44(auVar89._4_4_ +
                                                                              auVar89._4_4_,
                                                                              auVar89._0_4_ +
                                                                              auVar89._0_4_)))),
                                         auVar37);
              uVar135 = vcmpps_avx512vl(local_520,auVar107,6);
              local_230 = local_230 & (byte)uVar135;
              if (local_230 != 0) {
                auVar141._8_4_ = 0xbf800000;
                auVar141._0_8_ = 0xbf800000bf800000;
                auVar141._12_4_ = 0xbf800000;
                auVar141._16_4_ = 0xbf800000;
                auVar141._20_4_ = 0xbf800000;
                auVar141._24_4_ = 0xbf800000;
                auVar141._28_4_ = 0xbf800000;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_2c0 = vfmadd132ps_avx512vl(local_1c0,auVar141,auVar38);
                local_1c0 = local_2c0;
                auVar107 = local_1c0;
                local_280 = (undefined4)lVar73;
                local_270 = local_550._0_8_;
                uStack_268 = local_550._8_8_;
                local_260 = local_3c0._0_8_;
                uStack_258 = local_3c0._8_8_;
                local_250 = local_3d0._0_8_;
                uStack_248 = local_3d0._8_8_;
                local_240 = local_3b0._0_8_;
                uStack_238 = local_3b0._8_8_;
                pGVar75 = (context->scene->geometries).items[local_5f8].ptr;
                if ((pGVar75->mask & ray->mask) == 0) {
                  pRVar72 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar72 = context->args;
                  if ((pRVar72->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar72 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar72 >> 8),1),
                     pGVar75->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_160 = vmovdqa64_avx512vl(auVar194._0_32_);
                    auVar89 = vcvtsi2ss_avx512f(auVar102._0_16_,local_280);
                    fVar158 = auVar89._0_4_;
                    local_220[0] = (fVar158 + local_500._0_4_ + 0.0) * (float)local_300._0_4_;
                    local_220[1] = (fVar158 + local_500._4_4_ + 1.0) * (float)local_300._4_4_;
                    local_220[2] = (fVar158 + local_500._8_4_ + 2.0) * fStack_2f8;
                    local_220[3] = (fVar158 + local_500._12_4_ + 3.0) * fStack_2f4;
                    fStack_210 = (fVar158 + local_500._16_4_ + 4.0) * fStack_2f0;
                    fStack_20c = (fVar158 + local_500._20_4_ + 5.0) * fStack_2ec;
                    fStack_208 = (fVar158 + local_500._24_4_ + 6.0) * fStack_2e8;
                    fStack_204 = fVar158 + local_500._28_4_ + 7.0;
                    local_1c0._0_8_ = local_2c0._0_8_;
                    local_1c0._8_8_ = local_2c0._8_8_;
                    local_1c0._16_8_ = local_2c0._16_8_;
                    local_1c0._24_8_ = local_2c0._24_8_;
                    local_200 = local_1c0._0_8_;
                    uStack_1f8 = local_1c0._8_8_;
                    uStack_1f0 = local_1c0._16_8_;
                    uStack_1e8 = local_1c0._24_8_;
                    local_1e0 = local_520;
                    local_530 = local_3c0._0_8_;
                    uStack_528 = local_3c0._8_8_;
                    uVar70 = 0;
                    local_608 = (ulong)local_230;
                    for (uVar74 = local_608; (uVar74 & 1) == 0;
                        uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                      uVar70 = uVar70 + 1;
                    }
                    local_540 = local_3d0._0_4_;
                    fStack_53c = local_3d0._4_4_;
                    fStack_538 = local_3d0._8_4_;
                    fStack_534 = local_3d0._12_4_;
                    local_180 = local_3b0._0_8_;
                    uStack_178 = local_3b0._8_8_;
                    uVar74 = CONCAT71((int7)((ulong)pRVar72 >> 8),1);
                    local_570 = pGVar75;
                    local_2e0 = local_500;
                    local_2a0 = local_520;
                    local_27c = iVar8;
                    local_1c0 = auVar107;
                    do {
                      local_5e4 = (uint)uVar74;
                      local_5a4 = local_220[uVar70];
                      local_5a0 = *(undefined4 *)((long)&local_200 + uVar70 * 4);
                      local_560._0_4_ = ray->tfar;
                      ray->tfar = *(float *)(local_1e0 + uVar70 * 4);
                      local_5e0.context = context->user;
                      fVar142 = 1.0 - local_5a4;
                      fVar158 = fVar142 * fVar142 * -3.0;
                      auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),
                                                ZEXT416((uint)(local_5a4 * fVar142)),
                                                ZEXT416(0xc0000000));
                      auVar88 = vfmsub132ss_fma(ZEXT416((uint)(local_5a4 * fVar142)),
                                                ZEXT416((uint)(local_5a4 * local_5a4)),
                                                ZEXT416(0x40000000));
                      fVar142 = auVar89._0_4_ * 3.0;
                      fVar157 = auVar88._0_4_ * 3.0;
                      fVar163 = local_5a4 * local_5a4 * 3.0;
                      auVar176._0_4_ = fVar163 * (float)local_180;
                      auVar176._4_4_ = fVar163 * local_180._4_4_;
                      auVar176._8_4_ = fVar163 * (float)uStack_178;
                      auVar176._12_4_ = fVar163 * uStack_178._4_4_;
                      auVar155._4_4_ = fVar157;
                      auVar155._0_4_ = fVar157;
                      auVar155._8_4_ = fVar157;
                      auVar155._12_4_ = fVar157;
                      auVar65._4_4_ = fStack_53c;
                      auVar65._0_4_ = local_540;
                      auVar65._8_4_ = fStack_538;
                      auVar65._12_4_ = fStack_534;
                      auVar89 = vfmadd132ps_fma(auVar155,auVar176,auVar65);
                      auVar160._4_4_ = fVar142;
                      auVar160._0_4_ = fVar142;
                      auVar160._8_4_ = fVar142;
                      auVar160._12_4_ = fVar142;
                      auVar67._8_8_ = uStack_528;
                      auVar67._0_8_ = local_530;
                      auVar89 = vfmadd132ps_fma(auVar160,auVar89,auVar67);
                      auVar156._4_4_ = fVar158;
                      auVar156._0_4_ = fVar158;
                      auVar156._8_4_ = fVar158;
                      auVar156._12_4_ = fVar158;
                      auVar89 = vfmadd132ps_fma(auVar156,auVar89,local_550);
                      local_5b0 = vmovlps_avx(auVar89);
                      local_5a8 = vextractps_avx(auVar89,2);
                      local_59c = (undefined4)local_578;
                      local_598 = (undefined4)local_5f8;
                      local_594 = (local_5e0.context)->instID[0];
                      local_590 = (local_5e0.context)->instPrimID[0];
                      local_61c = -1;
                      local_5e0.valid = &local_61c;
                      pRVar72 = (RTCIntersectArguments *)pGVar75->userPtr;
                      local_5e0.hit = (RTCHitN *)&local_5b0;
                      local_5e0.N = 1;
                      local_600 = uVar70;
                      local_5e0.geometryUserPtr = pRVar72;
                      local_5e0.ray = (RTCRayN *)ray;
                      if ((pGVar75->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar75->occlusionFilterN)(&local_5e0), context = local_618,
                         pGVar75 = local_570, *local_5e0.valid != 0)) {
                        auVar89 = auVar202._0_16_;
                        pRVar72 = context->args;
                        if (pRVar72->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar72->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar75->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar72->filter)(&local_5e0);
                            pGVar75 = local_570;
                          }
                          auVar89 = auVar202._0_16_;
                          context = local_618;
                          if (*local_5e0.valid == 0) goto LAB_01c80d56;
                        }
                        uVar74 = (ulong)local_5e4;
                        break;
                      }
LAB_01c80d56:
                      auVar89 = auVar202._0_16_;
                      ray->tfar = (float)local_560._0_4_;
                      uVar70 = 0;
                      local_608 = local_608 ^ 1L << (local_600 & 0x3f);
                      for (uVar74 = local_608; (uVar74 & 1) == 0;
                          uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                        uVar70 = uVar70 + 1;
                      }
                      uVar74 = CONCAT71((int7)((ulong)pRVar72 >> 8),local_608 != 0);
                      context = local_618;
                    } while (local_608 != 0);
                    pRVar72 = (RTCIntersectArguments *)(ulong)((byte)uVar74 & 1);
                    auVar89 = vxorps_avx512vl(auVar89,auVar89);
                    auVar202 = ZEXT1664(auVar89);
                    auVar199 = ZEXT3264(local_400);
                    auVar200 = ZEXT3264(local_340);
                    auVar201 = ZEXT3264(local_420);
                    auVar207 = ZEXT3264(local_360);
                    auVar203 = ZEXT3264(local_440);
                    auVar204 = ZEXT3264(local_460);
                    auVar205 = ZEXT3264(local_380);
                    auVar206 = ZEXT3264(local_3a0);
                    auVar107 = vmovdqa64_avx512vl(local_160);
                    auVar194 = ZEXT3264(auVar107);
                  }
                }
                bVar77 = (bool)(bVar77 | (byte)pRVar72);
              }
            }
          }
          lVar73 = lVar73 + 8;
        } while ((int)lVar73 < iVar8);
      }
      if (bVar77 != false) {
        return local_621;
      }
      fVar158 = ray->tfar;
      auVar31._4_4_ = fVar158;
      auVar31._0_4_ = fVar158;
      auVar31._8_4_ = fVar158;
      auVar31._12_4_ = fVar158;
      uVar135 = vcmpps_avx512vl(local_170,auVar31,2);
      uVar76 = (uint)uVar78 & (uint)uVar78 + 0xf & (uint)uVar135;
      uVar78 = (ulong)uVar76;
      local_621 = uVar76 != 0;
      prim = local_610;
    } while (local_621);
  }
  return local_621;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }